

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  pointer pMVar6;
  Mat *this_00;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  uint uVar14;
  void *pvVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  void *pvVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  void *pvVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  float *ptr1_7;
  ulong uVar27;
  long lVar28;
  void *pvVar29;
  float *ptr_7;
  bool bVar30;
  float fVar31;
  float fVar32;
  Mat m;
  ulong local_e0;
  ulong local_d8;
  ulong local_c8;
  void *local_c0;
  Mat local_b8;
  ulong local_70;
  Mat *local_68;
  void *local_60;
  void *local_58;
  pointer local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  
  if (8 < (uint)this->op_type) {
    return 0;
  }
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_68 = this_00;
  local_50 = pMVar6;
  switch(this->op_type) {
  case 1:
    uVar1 = pMVar6->w;
    lVar22 = (long)(int)uVar1;
    uVar17 = (ulong)uVar1;
    sVar7 = pMVar6->elemsize;
    uVar26 = pMVar6[1].w;
    lVar28 = (long)(int)uVar26;
    uVar18 = (ulong)uVar26;
    uVar2 = pMVar6[1].h;
    uVar3 = pMVar6[1].c;
    uVar24 = (ulong)uVar3;
    uVar20 = uVar2 * uVar26;
    iVar25 = pMVar6->dims;
    if (iVar25 == 1) {
      iVar25 = pMVar6[1].dims;
      if (uVar1 != 1) {
        if (iVar25 == 1) {
          Mat::create(this_00,uVar1,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar6[1].w != 1) {
            if ((int)uVar1 < 1) {
              return 0;
            }
            pvVar15 = pMVar6->data;
            pvVar23 = pMVar6[1].data;
            uVar24 = 0;
            do {
              *(float *)((long)pvVar13 + uVar24 * 4) =
                   *(float *)((long)pvVar15 + uVar24 * 4) - *(float *)((long)pvVar23 + uVar24 * 4);
              uVar24 = uVar24 + 1;
            } while (uVar17 != uVar24);
            return 0;
          }
          if ((int)uVar1 < 1) {
            return 0;
          }
          fVar31 = *pMVar6[1].data;
          pvVar15 = pMVar6->data;
          uVar24 = 0;
          do {
            *(float *)((long)pvVar13 + uVar24 * 4) = *(float *)((long)pvVar15 + uVar24 * 4) - fVar31
            ;
            uVar24 = uVar24 + 1;
          } while (uVar17 != uVar24);
          return 0;
        }
        if (iVar25 == 2) {
          Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          uVar24 = 0;
          do {
            if (0 < (int)uVar26) {
              fVar31 = *(float *)((long)pvVar15 + uVar24 * 4);
              uVar17 = 0;
              do {
                *(float *)((long)pvVar13 + uVar17 * 4) =
                     fVar31 - *(float *)((long)pvVar23 + uVar17 * 4);
                uVar17 = uVar17 + 1;
              } while (uVar18 != uVar17);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar28 * 4);
            pvVar23 = (void *)((long)pvVar23 + lVar28 * 4);
          } while (uVar24 != uVar2);
          return 0;
        }
        if (iVar25 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        sVar8 = pMVar6[1].elemsize;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6[1].cstep;
        uVar17 = 0;
        do {
          if (0 < (int)uVar20) {
            fVar31 = *(float *)((long)pvVar15 + uVar17 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   fVar31 - *(float *)((long)pvVar23 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar20 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
        } while (uVar17 != uVar24);
        return 0;
      }
      if (iVar25 == 1) {
        Mat::create(this_00,uVar26,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar26 < 1) {
          return 0;
        }
        fVar31 = *pMVar6->data;
        pvVar15 = pMVar6[1].data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) = fVar31 - *(float *)((long)pvVar15 + uVar24 * 4);
          uVar24 = uVar24 + 1;
        } while (uVar18 != uVar24);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar20 < 1) {
          return 0;
        }
        fVar31 = *pMVar6->data;
        pvVar15 = pMVar6[1].data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) = fVar31 - *(float *)((long)pvVar15 + uVar24 * 4);
          uVar24 = uVar24 + 1;
        } while (uVar20 != uVar24);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar3 < 1) {
        return 0;
      }
      fVar31 = *pMVar6->data;
      pvVar15 = pMVar6[1].data;
      sVar8 = pMVar6[1].elemsize;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6[1].cstep;
      uVar17 = 0;
      do {
        if (0 < (int)uVar20) {
          uVar18 = 0;
          do {
            *(float *)((long)pvVar13 + uVar18 * 4) = fVar31 - *(float *)((long)pvVar15 + uVar18 * 4)
            ;
            uVar18 = uVar18 + 1;
          } while (uVar20 != uVar18);
        }
        uVar17 = uVar17 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      } while (uVar17 != uVar24);
      return 0;
    }
    uVar4 = pMVar6->h;
    uVar21 = (ulong)uVar4;
    uVar14 = uVar4 * uVar1;
    if (iVar25 == 2) {
      if (pMVar6[1].dims == 3) {
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        iVar25 = pMVar6->w;
        sVar8 = pMVar6->elemsize;
        sVar9 = pMVar6[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar6[1].cstep;
        uVar17 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar21 = 0;
            pvVar19 = pvVar23;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar26) {
                fVar31 = *(float *)((long)pvVar15 + uVar21 * 4 + (long)iVar25 * sVar8 * uVar17);
                uVar16 = 0;
                do {
                  *(float *)((long)pvVar29 + uVar16 * 4) =
                       fVar31 - *(float *)((long)pvVar19 + uVar16 * 4);
                  uVar16 = uVar16 + 1;
                } while (uVar18 != uVar16);
              }
              uVar21 = uVar21 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
            } while (uVar21 != uVar2);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
          pvVar23 = (void *)((long)pvVar23 + sVar9 * sVar11);
        } while (uVar17 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) =
               *(float *)((long)pvVar15 + uVar24 * 4) - *(float *)((long)pvVar23 + uVar24 * 4);
          uVar24 = uVar24 + 1;
        } while (uVar14 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          if (0 < (int)uVar1) {
            fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar15 + uVar18 * 4) - fVar31;
              uVar18 = uVar18 + 1;
            } while (uVar17 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar22 * 4);
          pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
        } while (uVar24 != uVar21);
        return 0;
      }
      if ((int)uVar14 < 1) {
        return 0;
      }
      fVar31 = *pMVar6[1].data;
      pvVar15 = pMVar6->data;
      uVar24 = 0;
      do {
        *(float *)((long)pvVar13 + uVar24 * 4) = *(float *)((long)pvVar15 + uVar24 * 4) - fVar31;
        uVar24 = uVar24 + 1;
      } while (uVar14 != uVar24);
      return 0;
    }
    if (iVar25 != 3) {
      return 0;
    }
    uVar5 = pMVar6->c;
    uVar16 = (ulong)uVar5;
    if (pMVar6[1].dims != 3) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        iVar25 = pMVar6[1].w;
        sVar9 = pMVar6[1].elemsize;
        pvVar23 = pMVar6[1].data;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar4) {
            uVar18 = 0;
            pvVar19 = pvVar15;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar1) {
                fVar31 = *(float *)((long)pvVar23 + uVar18 * 4 + (long)iVar25 * sVar9 * uVar24);
                uVar27 = 0;
                do {
                  *(float *)((long)pvVar29 + uVar27 * 4) =
                       *(float *)((long)pvVar19 + uVar27 * 4) - fVar31;
                  uVar27 = uVar27 + 1;
                } while (uVar17 != uVar27);
              }
              uVar18 = uVar18 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
            } while (uVar18 != uVar21);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar15 + uVar17 * 4) - fVar31;
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        } while (uVar24 != uVar16);
        return 0;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      fVar31 = *pMVar6[1].data;
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) = *(float *)((long)pvVar15 + uVar17 * 4) - fVar31
            ;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (((uVar26 == 1) && (uVar2 == 1)) && (uVar3 == uVar5)) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      pvVar23 = pMVar6[1].data;
      sVar9 = pMVar6[1].elemsize;
      sVar10 = pMVar6[1].cstep;
      sVar11 = this_00->elemsize;
      sVar12 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) =
                 *(float *)((long)pvVar15 + uVar17 * 4) -
                 *(float *)((long)pvVar23 + sVar9 * sVar10 * uVar24);
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (uVar26 == uVar1) {
      if (uVar3 == 1 && uVar4 == uVar2) {
        Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar15 + uVar17 * 4) - *(float *)((long)pvVar23 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (((uVar17 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) {
        if (uVar5 == 1 && uVar4 == uVar2) {
          Mat::create(this_00,uVar1,uVar4,uVar3,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          sVar8 = pMVar6[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar20) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar15 + uVar18 * 4) - *(float *)((long)pvVar23 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar20 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
          } while (uVar17 != uVar24);
          return 0;
        }
LAB_0022a01f:
        if ((((uVar1 != 1) && (uVar26 == 1)) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          sVar9 = pMVar6[1].elemsize;
          sVar10 = pMVar6[1].cstep;
          pvVar23 = pMVar6[1].data;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar6->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar18 = 0;
              pvVar19 = pvVar15;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar1) {
                  fVar31 = *(float *)((long)pvVar23 + uVar18 * 4 + sVar9 * sVar10 * uVar24);
                  uVar27 = 0;
                  do {
                    *(float *)((long)pvVar29 + uVar27 * 4) =
                         *(float *)((long)pvVar19 + uVar27 * 4) - fVar31;
                    uVar27 = uVar27 + 1;
                  } while (uVar17 != uVar27);
                }
                uVar18 = uVar18 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
              } while (uVar18 != uVar21);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar26 == uVar1) && (uVar4 != 1)) && ((uVar2 == 1 && (uVar3 == uVar5)))) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          pvVar23 = pMVar6[1].data;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = pMVar6[1].cstep;
          sVar12 = pMVar6->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar26 = 0;
              pvVar19 = pvVar15;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar1) {
                  uVar18 = 0;
                  do {
                    *(float *)((long)pvVar29 + uVar18 * 4) =
                         *(float *)((long)pvVar19 + uVar18 * 4) -
                         *(float *)((long)pvVar23 + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar17 != uVar18);
                }
                uVar26 = uVar26 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
              } while (uVar26 != uVar4);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar11);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar17 == 1 && uVar26 != 1) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar26,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          sVar9 = pMVar6->cstep;
          pvVar23 = pMVar6[1].data;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar6[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar17 = 0;
              pvVar19 = pvVar23;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar26) {
                  fVar31 = *(float *)((long)pvVar15 + uVar17 * 4 + sVar8 * sVar9 * uVar24);
                  uVar27 = 0;
                  do {
                    *(float *)((long)pvVar29 + uVar27 * 4) =
                         fVar31 - *(float *)((long)pvVar19 + uVar27 * 4);
                    uVar27 = uVar27 + 1;
                  } while (uVar18 != uVar27);
                }
                uVar17 = uVar17 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
              } while (uVar17 != uVar21);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
            pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar2 == 1 || uVar21 != 1) || uVar26 != uVar1) || (uVar3 != uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          if (local_68->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_68->c * local_68->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          local_e0 = 0;
          do {
            pMVar6 = local_50;
            bVar30 = local_50->dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_50->d;
            }
            local_b8.w = local_50->w;
            local_b8.h = local_50->h;
            local_b8.dims = bVar30 ^ 3;
            sVar7 = local_50->cstep;
            pvVar13 = local_50->data;
            sVar8 = local_50->elemsize;
            local_b8.data = (void *)(sVar7 * local_e0 * sVar8 + (long)pvVar13);
            local_b8.elempack = local_50->elempack;
            local_b8.allocator = local_50->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar8;
            Mat::~Mat(&local_b8);
            bVar30 = pMVar6[1].dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = pMVar6[1].d;
            }
            local_b8.w = pMVar6[1].w;
            local_b8.h = pMVar6[1].h;
            local_b8.dims = bVar30 ^ 3;
            local_70 = pMVar6[1].cstep;
            pvVar15 = pMVar6[1].data;
            local_b8.elemsize = pMVar6[1].elemsize;
            local_b8.data = (void *)(local_70 * local_e0 * local_b8.elemsize + (long)pvVar15);
            local_b8.elempack = pMVar6[1].elempack;
            local_b8.allocator = pMVar6[1].allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_60 = (void *)local_b8.elemsize;
            Mat::~Mat(&local_b8);
            bVar30 = local_68->dims == 3;
            local_b8.w = local_68->w;
            local_b8.h = local_68->h;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_68->d;
            }
            local_b8.dims = bVar30 ^ 3;
            sVar9 = local_68->cstep;
            pvVar23 = local_68->data;
            sVar10 = local_68->elemsize;
            local_b8.data = (void *)(sVar9 * local_e0 * sVar10 + (long)pvVar23);
            local_b8.elempack = local_68->elempack;
            local_b8.allocator = local_68->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar10;
            Mat::~Mat(&local_b8);
            if (0 < (int)uVar14) {
              uVar24 = 0;
              do {
                *(float *)((long)pvVar23 + uVar24 * 4 + sVar9 * sVar10 * local_e0) =
                     *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_e0) -
                     *(float *)((long)pvVar15 + uVar24 * 4 + local_70 * (long)local_60 * local_e0);
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            local_e0 = local_e0 + 1;
          } while (local_e0 != uVar16);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar2,uVar5,sVar7,opt->blob_allocator);
        if (local_68->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_68->c * local_68->cstep == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        local_d8 = 0;
        do {
          pMVar6 = local_50;
          bVar30 = local_50->dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_50->d;
          }
          local_b8.w = local_50->w;
          local_b8.h = local_50->h;
          local_b8.dims = bVar30 ^ 3;
          sVar7 = local_50->cstep;
          pvVar13 = local_50->data;
          sVar8 = local_50->elemsize;
          local_b8.data = (void *)(sVar7 * local_d8 * sVar8 + (long)pvVar13);
          local_b8.elempack = local_50->elempack;
          local_b8.allocator = local_50->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_b8.elemsize = sVar8;
          Mat::~Mat(&local_b8);
          bVar30 = pMVar6[1].dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = pMVar6[1].d;
          }
          local_b8.w = pMVar6[1].w;
          local_b8.h = pMVar6[1].h;
          local_b8.dims = bVar30 ^ 3;
          local_70 = pMVar6[1].cstep;
          pvVar15 = pMVar6[1].data;
          local_b8.elemsize = pMVar6[1].elemsize;
          local_b8.data = (void *)(local_70 * local_d8 * local_b8.elemsize + (long)pvVar15);
          local_b8.elempack = pMVar6[1].elempack;
          local_b8.allocator = pMVar6[1].allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_60 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          bVar30 = local_68->dims == 3;
          local_b8.w = local_68->w;
          local_b8.h = local_68->h;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_68->d;
          }
          local_b8.dims = bVar30 ^ 3;
          local_58 = (void *)local_68->cstep;
          pvVar23 = local_68->data;
          local_b8.elemsize = local_68->elemsize;
          local_b8.data = (void *)((long)local_58 * local_d8 * local_b8.elemsize + (long)pvVar23);
          local_b8.elempack = local_68->elempack;
          local_b8.allocator = local_68->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_48 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          if (0 < (int)uVar2) {
            pvVar23 = (void *)((long)pvVar23 + (long)local_58 * (long)local_48 * local_d8);
            pvVar15 = (void *)((long)pvVar15 + local_70 * (long)local_60 * local_d8);
            uVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar23 + uVar24 * 4) =
                       *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_d8) -
                       *(float *)((long)pvVar15 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (uVar17 != uVar24);
              }
              uVar26 = uVar26 + 1;
              pvVar23 = (void *)((long)pvVar23 + lVar22 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
            } while (uVar26 != uVar2);
          }
          local_d8 = local_d8 + 1;
        } while (local_d8 != uVar16);
        return 0;
      }
    }
    else if (((uVar17 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) goto LAB_0022a01f;
    Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
    pvVar13 = this_00->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    sVar7 = this_00->cstep;
    if ((long)this_00->c * sVar7 == 0) {
      return -100;
    }
    if ((int)uVar3 < 1) {
      return 0;
    }
    pvVar15 = pMVar6->data;
    sVar8 = pMVar6->elemsize;
    sVar9 = pMVar6->cstep;
    pvVar23 = pMVar6[1].data;
    sVar10 = pMVar6[1].elemsize;
    sVar11 = this_00->elemsize;
    sVar12 = pMVar6[1].cstep;
    uVar17 = 0;
    do {
      if (0 < (int)uVar20) {
        uVar18 = 0;
        do {
          *(float *)((long)pvVar13 + uVar18 * 4) =
               *(float *)((long)pvVar15 + sVar8 * sVar9 * uVar17) -
               *(float *)((long)pvVar23 + uVar18 * 4);
          uVar18 = uVar18 + 1;
        } while (uVar20 != uVar18);
      }
      uVar17 = uVar17 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
      pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
    } while (uVar17 != uVar24);
    return 0;
  case 2:
    uVar1 = pMVar6->w;
    lVar22 = (long)(int)uVar1;
    uVar17 = (ulong)uVar1;
    sVar7 = pMVar6->elemsize;
    uVar26 = pMVar6[1].w;
    lVar28 = (long)(int)uVar26;
    uVar18 = (ulong)uVar26;
    uVar2 = pMVar6[1].h;
    uVar3 = pMVar6[1].c;
    uVar24 = (ulong)uVar3;
    uVar20 = uVar2 * uVar26;
    iVar25 = pMVar6->dims;
    if (iVar25 == 1) {
      iVar25 = pMVar6[1].dims;
      if (uVar1 != 1) {
        if (iVar25 == 1) {
          Mat::create(this_00,uVar1,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar6[1].w != 1) {
            if ((int)uVar1 < 1) {
              return 0;
            }
            pvVar15 = pMVar6->data;
            pvVar23 = pMVar6[1].data;
            uVar24 = 0;
            do {
              *(float *)((long)pvVar13 + uVar24 * 4) =
                   *(float *)((long)pvVar23 + uVar24 * 4) * *(float *)((long)pvVar15 + uVar24 * 4);
              uVar24 = uVar24 + 1;
            } while (uVar17 != uVar24);
            return 0;
          }
          if ((int)uVar1 < 1) {
            return 0;
          }
          fVar31 = *pMVar6[1].data;
          pvVar15 = pMVar6->data;
          uVar24 = 0;
          do {
            *(float *)((long)pvVar13 + uVar24 * 4) = *(float *)((long)pvVar15 + uVar24 * 4) * fVar31
            ;
            uVar24 = uVar24 + 1;
          } while (uVar17 != uVar24);
          return 0;
        }
        if (iVar25 == 2) {
          Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          uVar24 = 0;
          do {
            if (0 < (int)uVar26) {
              fVar31 = *(float *)((long)pvVar15 + uVar24 * 4);
              uVar17 = 0;
              do {
                *(float *)((long)pvVar13 + uVar17 * 4) =
                     *(float *)((long)pvVar23 + uVar17 * 4) * fVar31;
                uVar17 = uVar17 + 1;
              } while (uVar18 != uVar17);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar28 * 4);
            pvVar23 = (void *)((long)pvVar23 + lVar28 * 4);
          } while (uVar24 != uVar2);
          return 0;
        }
        if (iVar25 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 != (void *)0x0) {
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          sVar8 = pMVar6[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar20) {
              fVar31 = *(float *)((long)pvVar15 + uVar17 * 4);
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar23 + uVar18 * 4) * fVar31;
                uVar18 = uVar18 + 1;
              } while (uVar20 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
          } while (uVar17 != uVar24);
          return 0;
        }
        return -100;
      }
      if (iVar25 == 1) {
        Mat::create(this_00,uVar26,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar26 < 1) {
          return 0;
        }
        fVar31 = *pMVar6->data;
        pvVar15 = pMVar6[1].data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) = *(float *)((long)pvVar15 + uVar24 * 4) * fVar31;
          uVar24 = uVar24 + 1;
        } while (uVar18 != uVar24);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar20 < 1) {
          return 0;
        }
        fVar31 = *pMVar6->data;
        pvVar15 = pMVar6[1].data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) = *(float *)((long)pvVar15 + uVar24 * 4) * fVar31;
          uVar24 = uVar24 + 1;
        } while (uVar20 != uVar24);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar3 < 1) {
        return 0;
      }
      fVar31 = *pMVar6->data;
      pvVar15 = pMVar6[1].data;
      sVar8 = pMVar6[1].elemsize;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6[1].cstep;
      uVar17 = 0;
      do {
        if (0 < (int)uVar20) {
          uVar18 = 0;
          do {
            *(float *)((long)pvVar13 + uVar18 * 4) = *(float *)((long)pvVar15 + uVar18 * 4) * fVar31
            ;
            uVar18 = uVar18 + 1;
          } while (uVar20 != uVar18);
        }
        uVar17 = uVar17 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      } while (uVar17 != uVar24);
      return 0;
    }
    uVar4 = pMVar6->h;
    uVar21 = (ulong)uVar4;
    uVar14 = uVar4 * uVar1;
    if (iVar25 == 2) {
      if (pMVar6[1].dims == 3) {
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        iVar25 = pMVar6->w;
        sVar8 = pMVar6->elemsize;
        sVar9 = pMVar6[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar6[1].cstep;
        uVar17 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar21 = 0;
            pvVar19 = pvVar23;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar26) {
                fVar31 = *(float *)((long)pvVar15 + uVar21 * 4 + (long)iVar25 * sVar8 * uVar17);
                uVar16 = 0;
                do {
                  *(float *)((long)pvVar29 + uVar16 * 4) =
                       *(float *)((long)pvVar19 + uVar16 * 4) * fVar31;
                  uVar16 = uVar16 + 1;
                } while (uVar18 != uVar16);
              }
              uVar21 = uVar21 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
            } while (uVar21 != uVar2);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
          pvVar23 = (void *)((long)pvVar23 + sVar9 * sVar11);
        } while (uVar17 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) =
               *(float *)((long)pvVar23 + uVar24 * 4) * *(float *)((long)pvVar15 + uVar24 * 4);
          uVar24 = uVar24 + 1;
        } while (uVar14 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          if (0 < (int)uVar1) {
            fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar15 + uVar18 * 4) * fVar31;
              uVar18 = uVar18 + 1;
            } while (uVar17 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar22 * 4);
          pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
        } while (uVar24 != uVar21);
        return 0;
      }
      if ((int)uVar14 < 1) {
        return 0;
      }
      fVar31 = *pMVar6[1].data;
      pvVar15 = pMVar6->data;
      uVar24 = 0;
      do {
        *(float *)((long)pvVar13 + uVar24 * 4) = *(float *)((long)pvVar15 + uVar24 * 4) * fVar31;
        uVar24 = uVar24 + 1;
      } while (uVar14 != uVar24);
      return 0;
    }
    if (iVar25 != 3) {
      return 0;
    }
    uVar5 = pMVar6->c;
    uVar16 = (ulong)uVar5;
    if (pMVar6[1].dims != 3) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        iVar25 = pMVar6[1].w;
        sVar9 = pMVar6[1].elemsize;
        pvVar23 = pMVar6[1].data;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar4) {
            uVar18 = 0;
            pvVar19 = pvVar15;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar1) {
                fVar31 = *(float *)((long)pvVar23 + uVar18 * 4 + (long)iVar25 * sVar9 * uVar24);
                uVar27 = 0;
                do {
                  *(float *)((long)pvVar29 + uVar27 * 4) =
                       *(float *)((long)pvVar19 + uVar27 * 4) * fVar31;
                  uVar27 = uVar27 + 1;
                } while (uVar17 != uVar27);
              }
              uVar18 = uVar18 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
            } while (uVar18 != uVar21);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar15 + uVar17 * 4) * fVar31;
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        } while (uVar24 != uVar16);
        return 0;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      fVar31 = *pMVar6[1].data;
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) = *(float *)((long)pvVar15 + uVar17 * 4) * fVar31
            ;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (((uVar26 == 1) && (uVar2 == 1)) && (uVar3 == uVar5)) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      pvVar23 = pMVar6[1].data;
      sVar9 = pMVar6[1].elemsize;
      sVar10 = pMVar6[1].cstep;
      sVar11 = this_00->elemsize;
      sVar12 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) =
                 *(float *)((long)pvVar23 + sVar9 * sVar10 * uVar24) *
                 *(float *)((long)pvVar15 + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (uVar26 == uVar1) {
      if (uVar3 == 1 && uVar4 == uVar2) {
        Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar23 + uVar17 * 4) * *(float *)((long)pvVar15 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (((uVar17 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) {
        if (uVar5 == 1 && uVar4 == uVar2) {
          Mat::create(this_00,uVar1,uVar4,uVar3,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          sVar8 = pMVar6[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar20) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar23 + uVar18 * 4) * *(float *)((long)pvVar15 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar20 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
          } while (uVar17 != uVar24);
          return 0;
        }
LAB_002294b5:
        if ((((uVar1 != 1) && (uVar26 == 1)) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          sVar9 = pMVar6[1].elemsize;
          sVar10 = pMVar6[1].cstep;
          pvVar23 = pMVar6[1].data;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar6->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar18 = 0;
              pvVar19 = pvVar15;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar1) {
                  fVar31 = *(float *)((long)pvVar23 + uVar18 * 4 + sVar9 * sVar10 * uVar24);
                  uVar27 = 0;
                  do {
                    *(float *)((long)pvVar29 + uVar27 * 4) =
                         *(float *)((long)pvVar19 + uVar27 * 4) * fVar31;
                    uVar27 = uVar27 + 1;
                  } while (uVar17 != uVar27);
                }
                uVar18 = uVar18 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
              } while (uVar18 != uVar21);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar26 == uVar1) && (uVar4 != 1)) && ((uVar2 == 1 && (uVar3 == uVar5)))) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          pvVar23 = pMVar6[1].data;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = pMVar6[1].cstep;
          sVar12 = pMVar6->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar26 = 0;
              pvVar19 = pvVar15;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar1) {
                  uVar18 = 0;
                  do {
                    *(float *)((long)pvVar29 + uVar18 * 4) =
                         *(float *)((long)pvVar23 + uVar18 * 4) *
                         *(float *)((long)pvVar19 + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar17 != uVar18);
                }
                uVar26 = uVar26 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
              } while (uVar26 != uVar4);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar11);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar17 == 1 && uVar26 != 1) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar26,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          sVar9 = pMVar6->cstep;
          pvVar23 = pMVar6[1].data;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar6[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar17 = 0;
              pvVar19 = pvVar23;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar26) {
                  fVar31 = *(float *)((long)pvVar15 + uVar17 * 4 + sVar8 * sVar9 * uVar24);
                  uVar27 = 0;
                  do {
                    *(float *)((long)pvVar29 + uVar27 * 4) =
                         *(float *)((long)pvVar19 + uVar27 * 4) * fVar31;
                    uVar27 = uVar27 + 1;
                  } while (uVar18 != uVar27);
                }
                uVar17 = uVar17 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
              } while (uVar17 != uVar21);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
            pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar2 == 1 || uVar21 != 1) || uVar26 != uVar1) || (uVar3 != uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          if (local_68->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_68->c * local_68->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          local_e0 = 0;
          do {
            pMVar6 = local_50;
            bVar30 = local_50->dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_50->d;
            }
            local_b8.w = local_50->w;
            local_b8.h = local_50->h;
            local_b8.dims = bVar30 ^ 3;
            sVar7 = local_50->cstep;
            pvVar13 = local_50->data;
            sVar8 = local_50->elemsize;
            local_b8.data = (void *)(sVar7 * local_e0 * sVar8 + (long)pvVar13);
            local_b8.elempack = local_50->elempack;
            local_b8.allocator = local_50->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar8;
            Mat::~Mat(&local_b8);
            bVar30 = pMVar6[1].dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = pMVar6[1].d;
            }
            local_b8.w = pMVar6[1].w;
            local_b8.h = pMVar6[1].h;
            local_b8.dims = bVar30 ^ 3;
            local_70 = pMVar6[1].cstep;
            pvVar15 = pMVar6[1].data;
            local_b8.elemsize = pMVar6[1].elemsize;
            local_b8.data = (void *)(local_70 * local_e0 * local_b8.elemsize + (long)pvVar15);
            local_b8.elempack = pMVar6[1].elempack;
            local_b8.allocator = pMVar6[1].allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_60 = (void *)local_b8.elemsize;
            Mat::~Mat(&local_b8);
            bVar30 = local_68->dims == 3;
            local_b8.w = local_68->w;
            local_b8.h = local_68->h;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_68->d;
            }
            local_b8.dims = bVar30 ^ 3;
            sVar9 = local_68->cstep;
            pvVar23 = local_68->data;
            sVar10 = local_68->elemsize;
            local_b8.data = (void *)(sVar9 * local_e0 * sVar10 + (long)pvVar23);
            local_b8.elempack = local_68->elempack;
            local_b8.allocator = local_68->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar10;
            Mat::~Mat(&local_b8);
            if (0 < (int)uVar14) {
              uVar24 = 0;
              do {
                *(float *)((long)pvVar23 + uVar24 * 4 + sVar9 * sVar10 * local_e0) =
                     *(float *)((long)pvVar15 + uVar24 * 4 + local_70 * (long)local_60 * local_e0) *
                     *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_e0);
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            local_e0 = local_e0 + 1;
          } while (local_e0 != uVar16);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar2,uVar5,sVar7,opt->blob_allocator);
        if (local_68->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_68->c * local_68->cstep == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        local_d8 = 0;
        do {
          pMVar6 = local_50;
          bVar30 = local_50->dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_50->d;
          }
          local_b8.w = local_50->w;
          local_b8.h = local_50->h;
          local_b8.dims = bVar30 ^ 3;
          sVar7 = local_50->cstep;
          pvVar13 = local_50->data;
          sVar8 = local_50->elemsize;
          local_b8.data = (void *)(sVar7 * local_d8 * sVar8 + (long)pvVar13);
          local_b8.elempack = local_50->elempack;
          local_b8.allocator = local_50->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_b8.elemsize = sVar8;
          Mat::~Mat(&local_b8);
          bVar30 = pMVar6[1].dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = pMVar6[1].d;
          }
          local_b8.w = pMVar6[1].w;
          local_b8.h = pMVar6[1].h;
          local_b8.dims = bVar30 ^ 3;
          local_70 = pMVar6[1].cstep;
          pvVar15 = pMVar6[1].data;
          local_b8.elemsize = pMVar6[1].elemsize;
          local_b8.data = (void *)(local_70 * local_d8 * local_b8.elemsize + (long)pvVar15);
          local_b8.elempack = pMVar6[1].elempack;
          local_b8.allocator = pMVar6[1].allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_60 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          bVar30 = local_68->dims == 3;
          local_b8.w = local_68->w;
          local_b8.h = local_68->h;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_68->d;
          }
          local_b8.dims = bVar30 ^ 3;
          local_58 = (void *)local_68->cstep;
          pvVar23 = local_68->data;
          local_b8.elemsize = local_68->elemsize;
          local_b8.data = (void *)((long)local_58 * local_d8 * local_b8.elemsize + (long)pvVar23);
          local_b8.elempack = local_68->elempack;
          local_b8.allocator = local_68->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_48 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          if (0 < (int)uVar2) {
            pvVar23 = (void *)((long)pvVar23 + (long)local_58 * (long)local_48 * local_d8);
            pvVar15 = (void *)((long)pvVar15 + local_70 * (long)local_60 * local_d8);
            uVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar23 + uVar24 * 4) =
                       *(float *)((long)pvVar15 + uVar24 * 4) *
                       *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_d8);
                  uVar24 = uVar24 + 1;
                } while (uVar17 != uVar24);
              }
              uVar26 = uVar26 + 1;
              pvVar23 = (void *)((long)pvVar23 + lVar22 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
            } while (uVar26 != uVar2);
          }
          local_d8 = local_d8 + 1;
        } while (local_d8 != uVar16);
        return 0;
      }
    }
    else if (((uVar17 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) goto LAB_002294b5;
    Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
    pvVar13 = this_00->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    sVar7 = this_00->cstep;
    if ((long)this_00->c * sVar7 == 0) {
      return -100;
    }
    if ((int)uVar3 < 1) {
      return 0;
    }
    pvVar15 = pMVar6->data;
    sVar8 = pMVar6->elemsize;
    sVar9 = pMVar6->cstep;
    pvVar23 = pMVar6[1].data;
    sVar10 = pMVar6[1].elemsize;
    sVar11 = this_00->elemsize;
    sVar12 = pMVar6[1].cstep;
    uVar17 = 0;
    do {
      if (0 < (int)uVar20) {
        uVar18 = 0;
        do {
          *(float *)((long)pvVar13 + uVar18 * 4) =
               *(float *)((long)pvVar23 + uVar18 * 4) *
               *(float *)((long)pvVar15 + sVar8 * sVar9 * uVar17);
          uVar18 = uVar18 + 1;
        } while (uVar20 != uVar18);
      }
      uVar17 = uVar17 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
      pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
    } while (uVar17 != uVar24);
    return 0;
  case 3:
    uVar1 = pMVar6->w;
    lVar22 = (long)(int)uVar1;
    uVar17 = (ulong)uVar1;
    sVar7 = pMVar6->elemsize;
    uVar26 = pMVar6[1].w;
    lVar28 = (long)(int)uVar26;
    uVar18 = (ulong)uVar26;
    uVar2 = pMVar6[1].h;
    uVar3 = pMVar6[1].c;
    uVar24 = (ulong)uVar3;
    uVar20 = uVar2 * uVar26;
    iVar25 = pMVar6->dims;
    if (iVar25 == 1) {
      iVar25 = pMVar6[1].dims;
      if (uVar1 != 1) {
        if (iVar25 == 1) {
          Mat::create(this_00,uVar1,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar6[1].w != 1) {
            if ((int)uVar1 < 1) {
              return 0;
            }
            pvVar15 = pMVar6->data;
            pvVar23 = pMVar6[1].data;
            uVar24 = 0;
            do {
              *(float *)((long)pvVar13 + uVar24 * 4) =
                   *(float *)((long)pvVar15 + uVar24 * 4) / *(float *)((long)pvVar23 + uVar24 * 4);
              uVar24 = uVar24 + 1;
            } while (uVar17 != uVar24);
            return 0;
          }
          if ((int)uVar1 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          fVar31 = *pMVar6[1].data;
          uVar24 = 0;
          do {
            *(float *)((long)pvVar13 + uVar24 * 4) =
                 *(float *)((long)pvVar15 + uVar24 * 4) * (1.0 / fVar31);
            uVar24 = uVar24 + 1;
          } while (uVar17 != uVar24);
          return 0;
        }
        if (iVar25 == 2) {
          Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          uVar24 = 0;
          do {
            if (0 < (int)uVar26) {
              fVar31 = *(float *)((long)pvVar15 + uVar24 * 4);
              uVar17 = 0;
              do {
                *(float *)((long)pvVar13 + uVar17 * 4) =
                     fVar31 / *(float *)((long)pvVar23 + uVar17 * 4);
                uVar17 = uVar17 + 1;
              } while (uVar18 != uVar17);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar28 * 4);
            pvVar23 = (void *)((long)pvVar23 + lVar28 * 4);
          } while (uVar24 != uVar2);
          return 0;
        }
        if (iVar25 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 != (void *)0x0) {
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          sVar8 = pMVar6[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar20) {
              fVar31 = *(float *)((long)pvVar15 + uVar17 * 4);
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     fVar31 / *(float *)((long)pvVar23 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar20 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
          } while (uVar17 != uVar24);
          return 0;
        }
        return -100;
      }
      if (iVar25 == 1) {
        Mat::create(this_00,uVar26,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar26 < 1) {
          return 0;
        }
        fVar31 = *pMVar6->data;
        pvVar15 = pMVar6[1].data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) = fVar31 / *(float *)((long)pvVar15 + uVar24 * 4);
          uVar24 = uVar24 + 1;
        } while (uVar18 != uVar24);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar20 < 1) {
          return 0;
        }
        fVar31 = *pMVar6->data;
        pvVar15 = pMVar6[1].data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) = fVar31 / *(float *)((long)pvVar15 + uVar24 * 4);
          uVar24 = uVar24 + 1;
        } while (uVar20 != uVar24);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar3 < 1) {
        return 0;
      }
      fVar31 = *pMVar6->data;
      pvVar15 = pMVar6[1].data;
      sVar8 = pMVar6[1].elemsize;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6[1].cstep;
      uVar17 = 0;
      do {
        if (0 < (int)uVar20) {
          uVar18 = 0;
          do {
            *(float *)((long)pvVar13 + uVar18 * 4) = fVar31 / *(float *)((long)pvVar15 + uVar18 * 4)
            ;
            uVar18 = uVar18 + 1;
          } while (uVar20 != uVar18);
        }
        uVar17 = uVar17 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      } while (uVar17 != uVar24);
      return 0;
    }
    uVar4 = pMVar6->h;
    uVar21 = (ulong)uVar4;
    uVar14 = uVar4 * uVar1;
    if (iVar25 == 2) {
      if (pMVar6[1].dims == 3) {
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        iVar25 = pMVar6->w;
        sVar8 = pMVar6->elemsize;
        sVar9 = pMVar6[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar6[1].cstep;
        uVar17 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar21 = 0;
            pvVar19 = pvVar23;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar26) {
                fVar31 = *(float *)((long)pvVar15 + uVar21 * 4 + (long)iVar25 * sVar8 * uVar17);
                uVar16 = 0;
                do {
                  *(float *)((long)pvVar29 + uVar16 * 4) =
                       fVar31 / *(float *)((long)pvVar19 + uVar16 * 4);
                  uVar16 = uVar16 + 1;
                } while (uVar18 != uVar16);
              }
              uVar21 = uVar21 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
            } while (uVar21 != uVar2);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
          pvVar23 = (void *)((long)pvVar23 + sVar9 * sVar11);
        } while (uVar17 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) =
               *(float *)((long)pvVar15 + uVar24 * 4) / *(float *)((long)pvVar23 + uVar24 * 4);
          uVar24 = uVar24 + 1;
        } while (uVar14 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          if (0 < (int)uVar1) {
            fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar15 + uVar18 * 4) * (1.0 / fVar31);
              uVar18 = uVar18 + 1;
            } while (uVar17 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar22 * 4);
          pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
        } while (uVar24 != uVar21);
        return 0;
      }
      if ((int)uVar14 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      fVar31 = *pMVar6[1].data;
      uVar24 = 0;
      do {
        *(float *)((long)pvVar13 + uVar24 * 4) =
             *(float *)((long)pvVar15 + uVar24 * 4) * (1.0 / fVar31);
        uVar24 = uVar24 + 1;
      } while (uVar14 != uVar24);
      return 0;
    }
    if (iVar25 != 3) {
      return 0;
    }
    uVar5 = pMVar6->c;
    uVar16 = (ulong)uVar5;
    if (pMVar6[1].dims != 3) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        iVar25 = pMVar6[1].w;
        sVar9 = pMVar6[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar4) {
            uVar18 = 0;
            pvVar19 = pvVar15;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar1) {
                fVar31 = *(float *)((long)pvVar23 + uVar18 * 4 + (long)iVar25 * sVar9 * uVar24);
                uVar27 = 0;
                do {
                  *(float *)((long)pvVar29 + uVar27 * 4) =
                       *(float *)((long)pvVar19 + uVar27 * 4) * (1.0 / fVar31);
                  uVar27 = uVar27 + 1;
                } while (uVar17 != uVar27);
              }
              uVar18 = uVar18 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
            } while (uVar18 != uVar21);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar15 + uVar17 * 4) * (1.0 / fVar31);
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        } while (uVar24 != uVar16);
        return 0;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      sVar8 = this_00->elemsize;
      sVar9 = pMVar6->elemsize;
      fVar31 = *pMVar6[1].data;
      sVar10 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) =
                 *(float *)((long)pvVar15 + uVar17 * 4) * (1.0 / fVar31);
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar8);
        pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar10);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (((uVar26 == 1) && (uVar2 == 1)) && (uVar3 == uVar5)) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      pvVar23 = pMVar6[1].data;
      sVar9 = pMVar6[1].elemsize;
      sVar10 = pMVar6[1].cstep;
      sVar11 = this_00->elemsize;
      sVar12 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) =
                 *(float *)((long)pvVar15 + uVar17 * 4) /
                 *(float *)((long)pvVar23 + sVar9 * sVar10 * uVar24);
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (uVar26 == uVar1) {
      if (uVar3 == 1 && uVar4 == uVar2) {
        Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar15 + uVar17 * 4) / *(float *)((long)pvVar23 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (((uVar17 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) {
        if (uVar5 == 1 && uVar4 == uVar2) {
          Mat::create(this_00,uVar1,uVar4,uVar3,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          sVar8 = pMVar6[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar20) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar15 + uVar18 * 4) / *(float *)((long)pvVar23 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar20 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
          } while (uVar17 != uVar24);
          return 0;
        }
LAB_0022978d:
        if ((((uVar1 != 1) && (uVar26 == 1)) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          pvVar23 = pMVar6[1].data;
          sVar9 = pMVar6[1].elemsize;
          sVar10 = pMVar6[1].cstep;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar6->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar18 = 0;
              pvVar19 = pvVar15;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar1) {
                  fVar31 = *(float *)((long)pvVar23 + uVar18 * 4 + sVar9 * sVar10 * uVar24);
                  uVar27 = 0;
                  do {
                    *(float *)((long)pvVar29 + uVar27 * 4) =
                         *(float *)((long)pvVar19 + uVar27 * 4) * (1.0 / fVar31);
                    uVar27 = uVar27 + 1;
                  } while (uVar17 != uVar27);
                }
                uVar18 = uVar18 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
              } while (uVar18 != uVar21);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar26 == uVar1) && (uVar4 != 1)) && ((uVar2 == 1 && (uVar3 == uVar5)))) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          pvVar23 = pMVar6[1].data;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = pMVar6[1].cstep;
          sVar12 = pMVar6->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar26 = 0;
              pvVar19 = pvVar15;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar1) {
                  uVar18 = 0;
                  do {
                    *(float *)((long)pvVar29 + uVar18 * 4) =
                         *(float *)((long)pvVar19 + uVar18 * 4) /
                         *(float *)((long)pvVar23 + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar17 != uVar18);
                }
                uVar26 = uVar26 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
              } while (uVar26 != uVar4);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar11);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar17 == 1 && uVar26 != 1) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar26,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          sVar9 = pMVar6->cstep;
          pvVar23 = pMVar6[1].data;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar6[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar17 = 0;
              pvVar19 = pvVar23;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar26) {
                  fVar31 = *(float *)((long)pvVar15 + uVar17 * 4 + sVar8 * sVar9 * uVar24);
                  uVar27 = 0;
                  do {
                    *(float *)((long)pvVar29 + uVar27 * 4) =
                         fVar31 / *(float *)((long)pvVar19 + uVar27 * 4);
                    uVar27 = uVar27 + 1;
                  } while (uVar18 != uVar27);
                }
                uVar17 = uVar17 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
              } while (uVar17 != uVar21);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
            pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar2 == 1 || uVar21 != 1) || uVar26 != uVar1) || (uVar3 != uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          if (local_68->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_68->c * local_68->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          local_e0 = 0;
          do {
            pMVar6 = local_50;
            bVar30 = local_50->dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_50->d;
            }
            local_b8.w = local_50->w;
            local_b8.h = local_50->h;
            local_b8.dims = bVar30 ^ 3;
            sVar7 = local_50->cstep;
            pvVar13 = local_50->data;
            sVar8 = local_50->elemsize;
            local_b8.data = (void *)(sVar7 * local_e0 * sVar8 + (long)pvVar13);
            local_b8.elempack = local_50->elempack;
            local_b8.allocator = local_50->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar8;
            Mat::~Mat(&local_b8);
            bVar30 = pMVar6[1].dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = pMVar6[1].d;
            }
            local_b8.w = pMVar6[1].w;
            local_b8.h = pMVar6[1].h;
            local_b8.dims = bVar30 ^ 3;
            local_70 = pMVar6[1].cstep;
            pvVar15 = pMVar6[1].data;
            local_b8.elemsize = pMVar6[1].elemsize;
            local_b8.data = (void *)(local_70 * local_e0 * local_b8.elemsize + (long)pvVar15);
            local_b8.elempack = pMVar6[1].elempack;
            local_b8.allocator = pMVar6[1].allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_60 = (void *)local_b8.elemsize;
            Mat::~Mat(&local_b8);
            bVar30 = local_68->dims == 3;
            local_b8.w = local_68->w;
            local_b8.h = local_68->h;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_68->d;
            }
            local_b8.dims = bVar30 ^ 3;
            sVar9 = local_68->cstep;
            pvVar23 = local_68->data;
            sVar10 = local_68->elemsize;
            local_b8.data = (void *)(sVar9 * local_e0 * sVar10 + (long)pvVar23);
            local_b8.elempack = local_68->elempack;
            local_b8.allocator = local_68->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar10;
            Mat::~Mat(&local_b8);
            if (0 < (int)uVar14) {
              uVar24 = 0;
              do {
                *(float *)((long)pvVar23 + uVar24 * 4 + sVar9 * sVar10 * local_e0) =
                     *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_e0) /
                     *(float *)((long)pvVar15 + uVar24 * 4 + local_70 * (long)local_60 * local_e0);
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            local_e0 = local_e0 + 1;
          } while (local_e0 != uVar16);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar2,uVar5,sVar7,opt->blob_allocator);
        if (local_68->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_68->c * local_68->cstep == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        local_d8 = 0;
        do {
          pMVar6 = local_50;
          bVar30 = local_50->dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_50->d;
          }
          local_b8.w = local_50->w;
          local_b8.h = local_50->h;
          local_b8.dims = bVar30 ^ 3;
          sVar7 = local_50->cstep;
          pvVar13 = local_50->data;
          sVar8 = local_50->elemsize;
          local_b8.data = (void *)(sVar7 * local_d8 * sVar8 + (long)pvVar13);
          local_b8.elempack = local_50->elempack;
          local_b8.allocator = local_50->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_b8.elemsize = sVar8;
          Mat::~Mat(&local_b8);
          bVar30 = pMVar6[1].dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = pMVar6[1].d;
          }
          local_b8.w = pMVar6[1].w;
          local_b8.h = pMVar6[1].h;
          local_b8.dims = bVar30 ^ 3;
          local_70 = pMVar6[1].cstep;
          pvVar15 = pMVar6[1].data;
          local_b8.elemsize = pMVar6[1].elemsize;
          local_b8.data = (void *)(local_70 * local_d8 * local_b8.elemsize + (long)pvVar15);
          local_b8.elempack = pMVar6[1].elempack;
          local_b8.allocator = pMVar6[1].allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_60 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          bVar30 = local_68->dims == 3;
          local_b8.w = local_68->w;
          local_b8.h = local_68->h;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_68->d;
          }
          local_b8.dims = bVar30 ^ 3;
          local_58 = (void *)local_68->cstep;
          pvVar23 = local_68->data;
          local_b8.elemsize = local_68->elemsize;
          local_b8.data = (void *)((long)local_58 * local_d8 * local_b8.elemsize + (long)pvVar23);
          local_b8.elempack = local_68->elempack;
          local_b8.allocator = local_68->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_48 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          if (0 < (int)uVar2) {
            pvVar23 = (void *)((long)pvVar23 + (long)local_58 * (long)local_48 * local_d8);
            pvVar15 = (void *)((long)pvVar15 + local_70 * (long)local_60 * local_d8);
            uVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar23 + uVar24 * 4) =
                       *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_d8) /
                       *(float *)((long)pvVar15 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (uVar17 != uVar24);
              }
              uVar26 = uVar26 + 1;
              pvVar23 = (void *)((long)pvVar23 + lVar22 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
            } while (uVar26 != uVar2);
          }
          local_d8 = local_d8 + 1;
        } while (local_d8 != uVar16);
        return 0;
      }
    }
    else if (((uVar17 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) goto LAB_0022978d;
    Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
    pvVar13 = this_00->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    sVar7 = this_00->cstep;
    if ((long)this_00->c * sVar7 == 0) {
      return -100;
    }
    if ((int)uVar3 < 1) {
      return 0;
    }
    pvVar15 = pMVar6->data;
    sVar8 = pMVar6->elemsize;
    sVar9 = pMVar6->cstep;
    pvVar23 = pMVar6[1].data;
    sVar10 = pMVar6[1].elemsize;
    sVar11 = this_00->elemsize;
    sVar12 = pMVar6[1].cstep;
    uVar17 = 0;
    do {
      if (0 < (int)uVar20) {
        uVar18 = 0;
        do {
          *(float *)((long)pvVar13 + uVar18 * 4) =
               *(float *)((long)pvVar15 + sVar8 * sVar9 * uVar17) /
               *(float *)((long)pvVar23 + uVar18 * 4);
          uVar18 = uVar18 + 1;
        } while (uVar20 != uVar18);
      }
      uVar17 = uVar17 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
      pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
    } while (uVar17 != uVar24);
    return 0;
  case 4:
    uVar1 = pMVar6->w;
    lVar22 = (long)(int)uVar1;
    uVar17 = (ulong)uVar1;
    sVar7 = pMVar6->elemsize;
    uVar26 = pMVar6[1].w;
    lVar28 = (long)(int)uVar26;
    uVar18 = (ulong)uVar26;
    uVar2 = pMVar6[1].h;
    uVar3 = pMVar6[1].c;
    uVar24 = (ulong)uVar3;
    uVar20 = uVar2 * uVar26;
    iVar25 = pMVar6->dims;
    if (iVar25 == 1) {
      iVar25 = pMVar6[1].dims;
      if (uVar1 != 1) {
        if (iVar25 == 1) {
          Mat::create(this_00,uVar1,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar6[1].w != 1) {
            if ((int)uVar1 < 1) {
              return 0;
            }
            pvVar15 = pMVar6->data;
            pvVar23 = pMVar6[1].data;
            uVar24 = 0;
            do {
              fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
              fVar32 = *(float *)((long)pvVar15 + uVar24 * 4);
              if (fVar31 <= fVar32) {
                fVar31 = fVar32;
              }
              *(float *)((long)pvVar13 + uVar24 * 4) = fVar31;
              uVar24 = uVar24 + 1;
            } while (uVar17 != uVar24);
            return 0;
          }
          if ((int)uVar1 < 1) {
            return 0;
          }
          fVar31 = *pMVar6[1].data;
          pvVar15 = pMVar6->data;
          uVar24 = 0;
          do {
            fVar32 = *(float *)((long)pvVar15 + uVar24 * 4);
            if (fVar32 <= fVar31) {
              fVar32 = fVar31;
            }
            *(float *)((long)pvVar13 + uVar24 * 4) = fVar32;
            uVar24 = uVar24 + 1;
          } while (uVar17 != uVar24);
          return 0;
        }
        if (iVar25 == 2) {
          Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          uVar24 = 0;
          do {
            if (0 < (int)uVar26) {
              fVar31 = *(float *)((long)pvVar15 + uVar24 * 4);
              uVar17 = 0;
              do {
                fVar32 = *(float *)((long)pvVar23 + uVar17 * 4);
                if (fVar32 <= fVar31) {
                  fVar32 = fVar31;
                }
                *(float *)((long)pvVar13 + uVar17 * 4) = fVar32;
                uVar17 = uVar17 + 1;
              } while (uVar18 != uVar17);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar28 * 4);
            pvVar23 = (void *)((long)pvVar23 + lVar28 * 4);
          } while (uVar24 != uVar2);
          return 0;
        }
        if (iVar25 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 != (void *)0x0) {
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          sVar8 = pMVar6[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar20) {
              fVar31 = *(float *)((long)pvVar15 + uVar17 * 4);
              uVar18 = 0;
              do {
                fVar32 = *(float *)((long)pvVar23 + uVar18 * 4);
                if (fVar32 <= fVar31) {
                  fVar32 = fVar31;
                }
                *(float *)((long)pvVar13 + uVar18 * 4) = fVar32;
                uVar18 = uVar18 + 1;
              } while (uVar20 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
          } while (uVar17 != uVar24);
          return 0;
        }
        return -100;
      }
      if (iVar25 == 1) {
        Mat::create(this_00,uVar26,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar26 < 1) {
          return 0;
        }
        fVar31 = *pMVar6->data;
        pvVar15 = pMVar6[1].data;
        uVar24 = 0;
        do {
          fVar32 = *(float *)((long)pvVar15 + uVar24 * 4);
          if (fVar32 <= fVar31) {
            fVar32 = fVar31;
          }
          *(float *)((long)pvVar13 + uVar24 * 4) = fVar32;
          uVar24 = uVar24 + 1;
        } while (uVar18 != uVar24);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar20 < 1) {
          return 0;
        }
        fVar31 = *pMVar6->data;
        pvVar15 = pMVar6[1].data;
        uVar24 = 0;
        do {
          fVar32 = *(float *)((long)pvVar15 + uVar24 * 4);
          if (fVar32 <= fVar31) {
            fVar32 = fVar31;
          }
          *(float *)((long)pvVar13 + uVar24 * 4) = fVar32;
          uVar24 = uVar24 + 1;
        } while (uVar20 != uVar24);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar3 < 1) {
        return 0;
      }
      fVar31 = *pMVar6->data;
      pvVar15 = pMVar6[1].data;
      sVar8 = pMVar6[1].elemsize;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6[1].cstep;
      uVar17 = 0;
      do {
        if (0 < (int)uVar20) {
          uVar18 = 0;
          do {
            fVar32 = *(float *)((long)pvVar15 + uVar18 * 4);
            if (fVar32 <= fVar31) {
              fVar32 = fVar31;
            }
            *(float *)((long)pvVar13 + uVar18 * 4) = fVar32;
            uVar18 = uVar18 + 1;
          } while (uVar20 != uVar18);
        }
        uVar17 = uVar17 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      } while (uVar17 != uVar24);
      return 0;
    }
    uVar4 = pMVar6->h;
    uVar21 = (ulong)uVar4;
    uVar14 = uVar4 * uVar1;
    if (iVar25 == 2) {
      if (pMVar6[1].dims == 3) {
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        iVar25 = pMVar6->w;
        sVar8 = pMVar6->elemsize;
        sVar9 = pMVar6[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar6[1].cstep;
        uVar17 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar21 = 0;
            pvVar19 = pvVar23;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar26) {
                fVar31 = *(float *)((long)pvVar15 + uVar21 * 4 + (long)iVar25 * sVar8 * uVar17);
                uVar16 = 0;
                do {
                  fVar32 = *(float *)((long)pvVar19 + uVar16 * 4);
                  if (fVar32 <= fVar31) {
                    fVar32 = fVar31;
                  }
                  *(float *)((long)pvVar29 + uVar16 * 4) = fVar32;
                  uVar16 = uVar16 + 1;
                } while (uVar18 != uVar16);
              }
              uVar21 = uVar21 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
            } while (uVar21 != uVar2);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
          pvVar23 = (void *)((long)pvVar23 + sVar9 * sVar11);
        } while (uVar17 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
          fVar32 = *(float *)((long)pvVar15 + uVar24 * 4);
          if (fVar31 <= fVar32) {
            fVar31 = fVar32;
          }
          *(float *)((long)pvVar13 + uVar24 * 4) = fVar31;
          uVar24 = uVar24 + 1;
        } while (uVar14 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          if (0 < (int)uVar1) {
            fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
            uVar18 = 0;
            do {
              fVar32 = *(float *)((long)pvVar15 + uVar18 * 4);
              if (fVar32 <= fVar31) {
                fVar32 = fVar31;
              }
              *(float *)((long)pvVar13 + uVar18 * 4) = fVar32;
              uVar18 = uVar18 + 1;
            } while (uVar17 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar22 * 4);
          pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
        } while (uVar24 != uVar21);
        return 0;
      }
      if ((int)uVar14 < 1) {
        return 0;
      }
      fVar31 = *pMVar6[1].data;
      pvVar15 = pMVar6->data;
      uVar24 = 0;
      do {
        fVar32 = *(float *)((long)pvVar15 + uVar24 * 4);
        if (fVar32 <= fVar31) {
          fVar32 = fVar31;
        }
        *(float *)((long)pvVar13 + uVar24 * 4) = fVar32;
        uVar24 = uVar24 + 1;
      } while (uVar14 != uVar24);
      return 0;
    }
    if (iVar25 != 3) {
      return 0;
    }
    uVar5 = pMVar6->c;
    uVar16 = (ulong)uVar5;
    if (pMVar6[1].dims != 3) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        iVar25 = pMVar6[1].w;
        sVar9 = pMVar6[1].elemsize;
        pvVar23 = pMVar6[1].data;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar4) {
            uVar18 = 0;
            pvVar19 = pvVar15;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar1) {
                fVar31 = *(float *)((long)pvVar23 + uVar18 * 4 + (long)iVar25 * sVar9 * uVar24);
                uVar27 = 0;
                do {
                  fVar32 = *(float *)((long)pvVar19 + uVar27 * 4);
                  if (fVar32 <= fVar31) {
                    fVar32 = fVar31;
                  }
                  *(float *)((long)pvVar29 + uVar27 * 4) = fVar32;
                  uVar27 = uVar27 + 1;
                } while (uVar17 != uVar27);
              }
              uVar18 = uVar18 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
            } while (uVar18 != uVar21);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
            uVar17 = 0;
            do {
              fVar32 = *(float *)((long)pvVar15 + uVar17 * 4);
              if (fVar32 <= fVar31) {
                fVar32 = fVar31;
              }
              *(float *)((long)pvVar13 + uVar17 * 4) = fVar32;
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        } while (uVar24 != uVar16);
        return 0;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      fVar31 = *pMVar6[1].data;
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            fVar32 = *(float *)((long)pvVar15 + uVar17 * 4);
            if (fVar32 <= fVar31) {
              fVar32 = fVar31;
            }
            *(float *)((long)pvVar13 + uVar17 * 4) = fVar32;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (((uVar26 == 1) && (uVar2 == 1)) && (uVar3 == uVar5)) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      pvVar23 = pMVar6[1].data;
      sVar9 = pMVar6[1].elemsize;
      sVar10 = pMVar6[1].cstep;
      sVar11 = this_00->elemsize;
      sVar12 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            fVar31 = *(float *)((long)pvVar23 + sVar9 * sVar10 * uVar24);
            fVar32 = *(float *)((long)pvVar15 + uVar17 * 4);
            if (fVar31 <= fVar32) {
              fVar31 = fVar32;
            }
            *(float *)((long)pvVar13 + uVar17 * 4) = fVar31;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (uVar26 == uVar1) {
      if (uVar3 == 1 && uVar4 == uVar2) {
        Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar17 = 0;
            do {
              fVar31 = *(float *)((long)pvVar23 + uVar17 * 4);
              fVar32 = *(float *)((long)pvVar15 + uVar17 * 4);
              if (fVar31 <= fVar32) {
                fVar31 = fVar32;
              }
              *(float *)((long)pvVar13 + uVar17 * 4) = fVar31;
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (((uVar17 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) {
        if (uVar5 == 1 && uVar4 == uVar2) {
          Mat::create(this_00,uVar1,uVar4,uVar3,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          sVar8 = pMVar6[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar20) {
              uVar18 = 0;
              do {
                fVar31 = *(float *)((long)pvVar23 + uVar18 * 4);
                fVar32 = *(float *)((long)pvVar15 + uVar18 * 4);
                if (fVar31 <= fVar32) {
                  fVar31 = fVar32;
                }
                *(float *)((long)pvVar13 + uVar18 * 4) = fVar31;
                uVar18 = uVar18 + 1;
              } while (uVar20 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
          } while (uVar17 != uVar24);
          return 0;
        }
LAB_002291dd:
        if ((((uVar1 != 1) && (uVar26 == 1)) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          sVar9 = pMVar6[1].elemsize;
          sVar10 = pMVar6[1].cstep;
          pvVar23 = pMVar6[1].data;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar6->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar18 = 0;
              pvVar19 = pvVar15;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar1) {
                  fVar31 = *(float *)((long)pvVar23 + uVar18 * 4 + sVar9 * sVar10 * uVar24);
                  uVar27 = 0;
                  do {
                    fVar32 = *(float *)((long)pvVar19 + uVar27 * 4);
                    if (fVar32 <= fVar31) {
                      fVar32 = fVar31;
                    }
                    *(float *)((long)pvVar29 + uVar27 * 4) = fVar32;
                    uVar27 = uVar27 + 1;
                  } while (uVar17 != uVar27);
                }
                uVar18 = uVar18 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
              } while (uVar18 != uVar21);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar26 == uVar1) && (uVar4 != 1)) && ((uVar2 == 1 && (uVar3 == uVar5)))) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          pvVar23 = pMVar6[1].data;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = pMVar6[1].cstep;
          sVar12 = pMVar6->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar26 = 0;
              pvVar19 = pvVar15;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar1) {
                  uVar18 = 0;
                  do {
                    fVar31 = *(float *)((long)pvVar23 + uVar18 * 4);
                    fVar32 = *(float *)((long)pvVar19 + uVar18 * 4);
                    if (fVar31 <= fVar32) {
                      fVar31 = fVar32;
                    }
                    *(float *)((long)pvVar29 + uVar18 * 4) = fVar31;
                    uVar18 = uVar18 + 1;
                  } while (uVar17 != uVar18);
                }
                uVar26 = uVar26 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
              } while (uVar26 != uVar4);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar11);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar17 == 1 && uVar26 != 1) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar26,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          sVar9 = pMVar6->cstep;
          pvVar23 = pMVar6[1].data;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar6[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar17 = 0;
              pvVar19 = pvVar23;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar26) {
                  fVar31 = *(float *)((long)pvVar15 + uVar17 * 4 + sVar8 * sVar9 * uVar24);
                  uVar27 = 0;
                  do {
                    fVar32 = *(float *)((long)pvVar19 + uVar27 * 4);
                    if (fVar32 <= fVar31) {
                      fVar32 = fVar31;
                    }
                    *(float *)((long)pvVar29 + uVar27 * 4) = fVar32;
                    uVar27 = uVar27 + 1;
                  } while (uVar18 != uVar27);
                }
                uVar17 = uVar17 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
              } while (uVar17 != uVar21);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
            pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar2 == 1 || uVar21 != 1) || uVar26 != uVar1) || (uVar3 != uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          if (local_68->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_68->c * local_68->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          local_e0 = 0;
          do {
            pMVar6 = local_50;
            bVar30 = local_50->dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_50->d;
            }
            local_b8.w = local_50->w;
            local_b8.h = local_50->h;
            local_b8.dims = bVar30 ^ 3;
            sVar7 = local_50->cstep;
            pvVar13 = local_50->data;
            sVar8 = local_50->elemsize;
            local_b8.data = (void *)(sVar7 * local_e0 * sVar8 + (long)pvVar13);
            local_b8.elempack = local_50->elempack;
            local_b8.allocator = local_50->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar8;
            Mat::~Mat(&local_b8);
            bVar30 = pMVar6[1].dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = pMVar6[1].d;
            }
            local_b8.w = pMVar6[1].w;
            local_b8.h = pMVar6[1].h;
            local_b8.dims = bVar30 ^ 3;
            local_70 = pMVar6[1].cstep;
            pvVar15 = pMVar6[1].data;
            local_b8.elemsize = pMVar6[1].elemsize;
            local_b8.data = (void *)(local_70 * local_e0 * local_b8.elemsize + (long)pvVar15);
            local_b8.elempack = pMVar6[1].elempack;
            local_b8.allocator = pMVar6[1].allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_60 = (void *)local_b8.elemsize;
            Mat::~Mat(&local_b8);
            bVar30 = local_68->dims == 3;
            local_b8.w = local_68->w;
            local_b8.h = local_68->h;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_68->d;
            }
            local_b8.dims = bVar30 ^ 3;
            sVar9 = local_68->cstep;
            pvVar23 = local_68->data;
            sVar10 = local_68->elemsize;
            local_b8.data = (void *)(sVar9 * local_e0 * sVar10 + (long)pvVar23);
            local_b8.elempack = local_68->elempack;
            local_b8.allocator = local_68->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar10;
            Mat::~Mat(&local_b8);
            if (0 < (int)uVar14) {
              uVar24 = 0;
              do {
                fVar31 = *(float *)((long)pvVar15 +
                                   uVar24 * 4 + local_70 * (long)local_60 * local_e0);
                fVar32 = *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_e0);
                if (fVar31 <= fVar32) {
                  fVar31 = fVar32;
                }
                *(float *)((long)pvVar23 + uVar24 * 4 + sVar9 * sVar10 * local_e0) = fVar31;
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            local_e0 = local_e0 + 1;
          } while (local_e0 != uVar16);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar2,uVar5,sVar7,opt->blob_allocator);
        if (local_68->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_68->c * local_68->cstep == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        local_d8 = 0;
        do {
          pMVar6 = local_50;
          bVar30 = local_50->dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_50->d;
          }
          local_b8.w = local_50->w;
          local_b8.h = local_50->h;
          local_b8.dims = bVar30 ^ 3;
          sVar7 = local_50->cstep;
          pvVar13 = local_50->data;
          sVar8 = local_50->elemsize;
          local_b8.data = (void *)(sVar7 * local_d8 * sVar8 + (long)pvVar13);
          local_b8.elempack = local_50->elempack;
          local_b8.allocator = local_50->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_b8.elemsize = sVar8;
          Mat::~Mat(&local_b8);
          bVar30 = pMVar6[1].dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = pMVar6[1].d;
          }
          local_b8.w = pMVar6[1].w;
          local_b8.h = pMVar6[1].h;
          local_b8.dims = bVar30 ^ 3;
          local_70 = pMVar6[1].cstep;
          pvVar15 = pMVar6[1].data;
          local_b8.elemsize = pMVar6[1].elemsize;
          local_b8.data = (void *)(local_70 * local_d8 * local_b8.elemsize + (long)pvVar15);
          local_b8.elempack = pMVar6[1].elempack;
          local_b8.allocator = pMVar6[1].allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_60 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          bVar30 = local_68->dims == 3;
          local_b8.w = local_68->w;
          local_b8.h = local_68->h;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_68->d;
          }
          local_b8.dims = bVar30 ^ 3;
          local_58 = (void *)local_68->cstep;
          pvVar23 = local_68->data;
          local_b8.elemsize = local_68->elemsize;
          local_b8.data = (void *)((long)local_58 * local_d8 * local_b8.elemsize + (long)pvVar23);
          local_b8.elempack = local_68->elempack;
          local_b8.allocator = local_68->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_48 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          if (0 < (int)uVar2) {
            pvVar23 = (void *)((long)pvVar23 + (long)local_58 * (long)local_48 * local_d8);
            pvVar15 = (void *)((long)pvVar15 + local_70 * (long)local_60 * local_d8);
            uVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                uVar24 = 0;
                do {
                  fVar31 = *(float *)((long)pvVar15 + uVar24 * 4);
                  fVar32 = *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_d8);
                  if (fVar31 <= fVar32) {
                    fVar31 = fVar32;
                  }
                  *(float *)((long)pvVar23 + uVar24 * 4) = fVar31;
                  uVar24 = uVar24 + 1;
                } while (uVar17 != uVar24);
              }
              uVar26 = uVar26 + 1;
              pvVar23 = (void *)((long)pvVar23 + lVar22 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
            } while (uVar26 != uVar2);
          }
          local_d8 = local_d8 + 1;
        } while (local_d8 != uVar16);
        return 0;
      }
    }
    else if (((uVar17 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) goto LAB_002291dd;
    Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
    pvVar13 = this_00->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    sVar7 = this_00->cstep;
    if ((long)this_00->c * sVar7 == 0) {
      return -100;
    }
    if ((int)uVar3 < 1) {
      return 0;
    }
    pvVar15 = pMVar6->data;
    sVar8 = pMVar6->elemsize;
    sVar9 = pMVar6->cstep;
    pvVar23 = pMVar6[1].data;
    sVar10 = pMVar6[1].elemsize;
    sVar11 = this_00->elemsize;
    sVar12 = pMVar6[1].cstep;
    uVar17 = 0;
    do {
      if (0 < (int)uVar20) {
        uVar18 = 0;
        do {
          fVar31 = *(float *)((long)pvVar23 + uVar18 * 4);
          fVar32 = *(float *)((long)pvVar15 + sVar8 * sVar9 * uVar17);
          if (fVar31 <= fVar32) {
            fVar31 = fVar32;
          }
          *(float *)((long)pvVar13 + uVar18 * 4) = fVar31;
          uVar18 = uVar18 + 1;
        } while (uVar20 != uVar18);
      }
      uVar17 = uVar17 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
      pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
    } while (uVar17 != uVar24);
    return 0;
  case 5:
    uVar1 = pMVar6->w;
    lVar22 = (long)(int)uVar1;
    uVar17 = (ulong)uVar1;
    sVar7 = pMVar6->elemsize;
    uVar26 = pMVar6[1].w;
    lVar28 = (long)(int)uVar26;
    uVar18 = (ulong)uVar26;
    uVar2 = pMVar6[1].h;
    uVar3 = pMVar6[1].c;
    uVar24 = (ulong)uVar3;
    uVar20 = uVar2 * uVar26;
    iVar25 = pMVar6->dims;
    if (iVar25 == 1) {
      iVar25 = pMVar6[1].dims;
      if (uVar1 != 1) {
        if (iVar25 == 1) {
          Mat::create(this_00,uVar1,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar6[1].w != 1) {
            if ((int)uVar1 < 1) {
              return 0;
            }
            pvVar15 = pMVar6->data;
            pvVar23 = pMVar6[1].data;
            uVar24 = 0;
            do {
              fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
              fVar32 = *(float *)((long)pvVar15 + uVar24 * 4);
              if (fVar32 <= fVar31) {
                fVar31 = fVar32;
              }
              *(float *)((long)pvVar13 + uVar24 * 4) = fVar31;
              uVar24 = uVar24 + 1;
            } while (uVar17 != uVar24);
            return 0;
          }
          if ((int)uVar1 < 1) {
            return 0;
          }
          fVar31 = *pMVar6[1].data;
          pvVar15 = pMVar6->data;
          uVar24 = 0;
          do {
            fVar32 = *(float *)((long)pvVar15 + uVar24 * 4);
            if (fVar31 <= fVar32) {
              fVar32 = fVar31;
            }
            *(float *)((long)pvVar13 + uVar24 * 4) = fVar32;
            uVar24 = uVar24 + 1;
          } while (uVar17 != uVar24);
          return 0;
        }
        if (iVar25 == 2) {
          Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          uVar24 = 0;
          do {
            if (0 < (int)uVar26) {
              fVar31 = *(float *)((long)pvVar15 + uVar24 * 4);
              uVar17 = 0;
              do {
                fVar32 = *(float *)((long)pvVar23 + uVar17 * 4);
                if (fVar31 <= fVar32) {
                  fVar32 = fVar31;
                }
                *(float *)((long)pvVar13 + uVar17 * 4) = fVar32;
                uVar17 = uVar17 + 1;
              } while (uVar18 != uVar17);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar28 * 4);
            pvVar23 = (void *)((long)pvVar23 + lVar28 * 4);
          } while (uVar24 != uVar2);
          return 0;
        }
        if (iVar25 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 != (void *)0x0) {
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          sVar8 = pMVar6[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar20) {
              fVar31 = *(float *)((long)pvVar15 + uVar17 * 4);
              uVar18 = 0;
              do {
                fVar32 = *(float *)((long)pvVar23 + uVar18 * 4);
                if (fVar31 <= fVar32) {
                  fVar32 = fVar31;
                }
                *(float *)((long)pvVar13 + uVar18 * 4) = fVar32;
                uVar18 = uVar18 + 1;
              } while (uVar20 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
          } while (uVar17 != uVar24);
          return 0;
        }
        return -100;
      }
      if (iVar25 == 1) {
        Mat::create(this_00,uVar26,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar26 < 1) {
          return 0;
        }
        fVar31 = *pMVar6->data;
        pvVar15 = pMVar6[1].data;
        uVar24 = 0;
        do {
          fVar32 = *(float *)((long)pvVar15 + uVar24 * 4);
          if (fVar31 <= fVar32) {
            fVar32 = fVar31;
          }
          *(float *)((long)pvVar13 + uVar24 * 4) = fVar32;
          uVar24 = uVar24 + 1;
        } while (uVar18 != uVar24);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar20 < 1) {
          return 0;
        }
        fVar31 = *pMVar6->data;
        pvVar15 = pMVar6[1].data;
        uVar24 = 0;
        do {
          fVar32 = *(float *)((long)pvVar15 + uVar24 * 4);
          if (fVar31 <= fVar32) {
            fVar32 = fVar31;
          }
          *(float *)((long)pvVar13 + uVar24 * 4) = fVar32;
          uVar24 = uVar24 + 1;
        } while (uVar20 != uVar24);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar3 < 1) {
        return 0;
      }
      fVar31 = *pMVar6->data;
      pvVar15 = pMVar6[1].data;
      sVar8 = pMVar6[1].elemsize;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6[1].cstep;
      uVar17 = 0;
      do {
        if (0 < (int)uVar20) {
          uVar18 = 0;
          do {
            fVar32 = *(float *)((long)pvVar15 + uVar18 * 4);
            if (fVar31 <= fVar32) {
              fVar32 = fVar31;
            }
            *(float *)((long)pvVar13 + uVar18 * 4) = fVar32;
            uVar18 = uVar18 + 1;
          } while (uVar20 != uVar18);
        }
        uVar17 = uVar17 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      } while (uVar17 != uVar24);
      return 0;
    }
    uVar4 = pMVar6->h;
    uVar21 = (ulong)uVar4;
    uVar14 = uVar4 * uVar1;
    if (iVar25 == 2) {
      if (pMVar6[1].dims == 3) {
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        iVar25 = pMVar6->w;
        sVar8 = pMVar6->elemsize;
        sVar9 = pMVar6[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar6[1].cstep;
        uVar17 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar21 = 0;
            pvVar19 = pvVar23;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar26) {
                fVar31 = *(float *)((long)pvVar15 + uVar21 * 4 + (long)iVar25 * sVar8 * uVar17);
                uVar16 = 0;
                do {
                  fVar32 = *(float *)((long)pvVar19 + uVar16 * 4);
                  if (fVar31 <= fVar32) {
                    fVar32 = fVar31;
                  }
                  *(float *)((long)pvVar29 + uVar16 * 4) = fVar32;
                  uVar16 = uVar16 + 1;
                } while (uVar18 != uVar16);
              }
              uVar21 = uVar21 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
            } while (uVar21 != uVar2);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
          pvVar23 = (void *)((long)pvVar23 + sVar9 * sVar11);
        } while (uVar17 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
          fVar32 = *(float *)((long)pvVar15 + uVar24 * 4);
          if (fVar32 <= fVar31) {
            fVar31 = fVar32;
          }
          *(float *)((long)pvVar13 + uVar24 * 4) = fVar31;
          uVar24 = uVar24 + 1;
        } while (uVar14 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          if (0 < (int)uVar1) {
            fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
            uVar18 = 0;
            do {
              fVar32 = *(float *)((long)pvVar15 + uVar18 * 4);
              if (fVar31 <= fVar32) {
                fVar32 = fVar31;
              }
              *(float *)((long)pvVar13 + uVar18 * 4) = fVar32;
              uVar18 = uVar18 + 1;
            } while (uVar17 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar22 * 4);
          pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
        } while (uVar24 != uVar21);
        return 0;
      }
      if ((int)uVar14 < 1) {
        return 0;
      }
      fVar31 = *pMVar6[1].data;
      pvVar15 = pMVar6->data;
      uVar24 = 0;
      do {
        fVar32 = *(float *)((long)pvVar15 + uVar24 * 4);
        if (fVar31 <= fVar32) {
          fVar32 = fVar31;
        }
        *(float *)((long)pvVar13 + uVar24 * 4) = fVar32;
        uVar24 = uVar24 + 1;
      } while (uVar14 != uVar24);
      return 0;
    }
    if (iVar25 != 3) {
      return 0;
    }
    uVar5 = pMVar6->c;
    uVar16 = (ulong)uVar5;
    if (pMVar6[1].dims != 3) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        iVar25 = pMVar6[1].w;
        sVar9 = pMVar6[1].elemsize;
        pvVar23 = pMVar6[1].data;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar4) {
            uVar18 = 0;
            pvVar19 = pvVar15;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar1) {
                fVar31 = *(float *)((long)pvVar23 + uVar18 * 4 + (long)iVar25 * sVar9 * uVar24);
                uVar27 = 0;
                do {
                  fVar32 = *(float *)((long)pvVar19 + uVar27 * 4);
                  if (fVar31 <= fVar32) {
                    fVar32 = fVar31;
                  }
                  *(float *)((long)pvVar29 + uVar27 * 4) = fVar32;
                  uVar27 = uVar27 + 1;
                } while (uVar17 != uVar27);
              }
              uVar18 = uVar18 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
            } while (uVar18 != uVar21);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
            uVar17 = 0;
            do {
              fVar32 = *(float *)((long)pvVar15 + uVar17 * 4);
              if (fVar31 <= fVar32) {
                fVar32 = fVar31;
              }
              *(float *)((long)pvVar13 + uVar17 * 4) = fVar32;
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        } while (uVar24 != uVar16);
        return 0;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      fVar31 = *pMVar6[1].data;
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            fVar32 = *(float *)((long)pvVar15 + uVar17 * 4);
            if (fVar31 <= fVar32) {
              fVar32 = fVar31;
            }
            *(float *)((long)pvVar13 + uVar17 * 4) = fVar32;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (((uVar26 == 1) && (uVar2 == 1)) && (uVar3 == uVar5)) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      pvVar23 = pMVar6[1].data;
      sVar9 = pMVar6[1].elemsize;
      sVar10 = pMVar6[1].cstep;
      sVar11 = this_00->elemsize;
      sVar12 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            fVar31 = *(float *)((long)pvVar23 + sVar9 * sVar10 * uVar24);
            fVar32 = *(float *)((long)pvVar15 + uVar17 * 4);
            if (fVar32 <= fVar31) {
              fVar31 = fVar32;
            }
            *(float *)((long)pvVar13 + uVar17 * 4) = fVar31;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (uVar26 == uVar1) {
      if (uVar3 == 1 && uVar4 == uVar2) {
        Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar17 = 0;
            do {
              fVar31 = *(float *)((long)pvVar23 + uVar17 * 4);
              fVar32 = *(float *)((long)pvVar15 + uVar17 * 4);
              if (fVar32 <= fVar31) {
                fVar31 = fVar32;
              }
              *(float *)((long)pvVar13 + uVar17 * 4) = fVar31;
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (((uVar17 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) {
        if (uVar5 == 1 && uVar4 == uVar2) {
          Mat::create(this_00,uVar1,uVar4,uVar3,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          sVar8 = pMVar6[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar20) {
              uVar18 = 0;
              do {
                fVar31 = *(float *)((long)pvVar23 + uVar18 * 4);
                fVar32 = *(float *)((long)pvVar15 + uVar18 * 4);
                if (fVar32 <= fVar31) {
                  fVar31 = fVar32;
                }
                *(float *)((long)pvVar13 + uVar18 * 4) = fVar31;
                uVar18 = uVar18 + 1;
              } while (uVar20 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
          } while (uVar17 != uVar24);
          return 0;
        }
LAB_0022a2f7:
        if ((((uVar1 != 1) && (uVar26 == 1)) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          sVar9 = pMVar6[1].elemsize;
          sVar10 = pMVar6[1].cstep;
          pvVar23 = pMVar6[1].data;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar6->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar18 = 0;
              pvVar19 = pvVar15;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar1) {
                  fVar31 = *(float *)((long)pvVar23 + uVar18 * 4 + sVar9 * sVar10 * uVar24);
                  uVar27 = 0;
                  do {
                    fVar32 = *(float *)((long)pvVar19 + uVar27 * 4);
                    if (fVar31 <= fVar32) {
                      fVar32 = fVar31;
                    }
                    *(float *)((long)pvVar29 + uVar27 * 4) = fVar32;
                    uVar27 = uVar27 + 1;
                  } while (uVar17 != uVar27);
                }
                uVar18 = uVar18 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
              } while (uVar18 != uVar21);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar26 == uVar1) && (uVar4 != 1)) && ((uVar2 == 1 && (uVar3 == uVar5)))) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          pvVar23 = pMVar6[1].data;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = pMVar6[1].cstep;
          sVar12 = pMVar6->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar26 = 0;
              pvVar19 = pvVar15;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar1) {
                  uVar18 = 0;
                  do {
                    fVar31 = *(float *)((long)pvVar23 + uVar18 * 4);
                    fVar32 = *(float *)((long)pvVar19 + uVar18 * 4);
                    if (fVar32 <= fVar31) {
                      fVar31 = fVar32;
                    }
                    *(float *)((long)pvVar29 + uVar18 * 4) = fVar31;
                    uVar18 = uVar18 + 1;
                  } while (uVar17 != uVar18);
                }
                uVar26 = uVar26 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
              } while (uVar26 != uVar4);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar11);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar17 == 1 && uVar26 != 1) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar26,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          sVar9 = pMVar6->cstep;
          pvVar23 = pMVar6[1].data;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar6[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar17 = 0;
              pvVar19 = pvVar23;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar26) {
                  fVar31 = *(float *)((long)pvVar15 + uVar17 * 4 + sVar8 * sVar9 * uVar24);
                  uVar27 = 0;
                  do {
                    fVar32 = *(float *)((long)pvVar19 + uVar27 * 4);
                    if (fVar31 <= fVar32) {
                      fVar32 = fVar31;
                    }
                    *(float *)((long)pvVar29 + uVar27 * 4) = fVar32;
                    uVar27 = uVar27 + 1;
                  } while (uVar18 != uVar27);
                }
                uVar17 = uVar17 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
              } while (uVar17 != uVar21);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
            pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar2 == 1 || uVar21 != 1) || uVar26 != uVar1) || (uVar3 != uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          if (local_68->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_68->c * local_68->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          local_e0 = 0;
          do {
            pMVar6 = local_50;
            bVar30 = local_50->dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_50->d;
            }
            local_b8.w = local_50->w;
            local_b8.h = local_50->h;
            local_b8.dims = bVar30 ^ 3;
            sVar7 = local_50->cstep;
            pvVar13 = local_50->data;
            sVar8 = local_50->elemsize;
            local_b8.data = (void *)(sVar7 * local_e0 * sVar8 + (long)pvVar13);
            local_b8.elempack = local_50->elempack;
            local_b8.allocator = local_50->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar8;
            Mat::~Mat(&local_b8);
            bVar30 = pMVar6[1].dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = pMVar6[1].d;
            }
            local_b8.w = pMVar6[1].w;
            local_b8.h = pMVar6[1].h;
            local_b8.dims = bVar30 ^ 3;
            local_70 = pMVar6[1].cstep;
            pvVar15 = pMVar6[1].data;
            local_b8.elemsize = pMVar6[1].elemsize;
            local_b8.data = (void *)(local_70 * local_e0 * local_b8.elemsize + (long)pvVar15);
            local_b8.elempack = pMVar6[1].elempack;
            local_b8.allocator = pMVar6[1].allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_60 = (void *)local_b8.elemsize;
            Mat::~Mat(&local_b8);
            bVar30 = local_68->dims == 3;
            local_b8.w = local_68->w;
            local_b8.h = local_68->h;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_68->d;
            }
            local_b8.dims = bVar30 ^ 3;
            sVar9 = local_68->cstep;
            pvVar23 = local_68->data;
            sVar10 = local_68->elemsize;
            local_b8.data = (void *)(sVar9 * local_e0 * sVar10 + (long)pvVar23);
            local_b8.elempack = local_68->elempack;
            local_b8.allocator = local_68->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar10;
            Mat::~Mat(&local_b8);
            if (0 < (int)uVar14) {
              uVar24 = 0;
              do {
                fVar31 = *(float *)((long)pvVar15 +
                                   uVar24 * 4 + local_70 * (long)local_60 * local_e0);
                fVar32 = *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_e0);
                if (fVar32 <= fVar31) {
                  fVar31 = fVar32;
                }
                *(float *)((long)pvVar23 + uVar24 * 4 + sVar9 * sVar10 * local_e0) = fVar31;
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            local_e0 = local_e0 + 1;
          } while (local_e0 != uVar16);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar2,uVar5,sVar7,opt->blob_allocator);
        if (local_68->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_68->c * local_68->cstep == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        local_d8 = 0;
        do {
          pMVar6 = local_50;
          bVar30 = local_50->dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_50->d;
          }
          local_b8.w = local_50->w;
          local_b8.h = local_50->h;
          local_b8.dims = bVar30 ^ 3;
          sVar7 = local_50->cstep;
          pvVar13 = local_50->data;
          sVar8 = local_50->elemsize;
          local_b8.data = (void *)(sVar7 * local_d8 * sVar8 + (long)pvVar13);
          local_b8.elempack = local_50->elempack;
          local_b8.allocator = local_50->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_b8.elemsize = sVar8;
          Mat::~Mat(&local_b8);
          bVar30 = pMVar6[1].dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = pMVar6[1].d;
          }
          local_b8.w = pMVar6[1].w;
          local_b8.h = pMVar6[1].h;
          local_b8.dims = bVar30 ^ 3;
          local_70 = pMVar6[1].cstep;
          pvVar15 = pMVar6[1].data;
          local_b8.elemsize = pMVar6[1].elemsize;
          local_b8.data = (void *)(local_70 * local_d8 * local_b8.elemsize + (long)pvVar15);
          local_b8.elempack = pMVar6[1].elempack;
          local_b8.allocator = pMVar6[1].allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_60 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          bVar30 = local_68->dims == 3;
          local_b8.w = local_68->w;
          local_b8.h = local_68->h;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_68->d;
          }
          local_b8.dims = bVar30 ^ 3;
          local_58 = (void *)local_68->cstep;
          pvVar23 = local_68->data;
          local_b8.elemsize = local_68->elemsize;
          local_b8.data = (void *)((long)local_58 * local_d8 * local_b8.elemsize + (long)pvVar23);
          local_b8.elempack = local_68->elempack;
          local_b8.allocator = local_68->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_48 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          if (0 < (int)uVar2) {
            pvVar23 = (void *)((long)pvVar23 + (long)local_58 * (long)local_48 * local_d8);
            pvVar15 = (void *)((long)pvVar15 + local_70 * (long)local_60 * local_d8);
            uVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                uVar24 = 0;
                do {
                  fVar31 = *(float *)((long)pvVar15 + uVar24 * 4);
                  fVar32 = *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_d8);
                  if (fVar32 <= fVar31) {
                    fVar31 = fVar32;
                  }
                  *(float *)((long)pvVar23 + uVar24 * 4) = fVar31;
                  uVar24 = uVar24 + 1;
                } while (uVar17 != uVar24);
              }
              uVar26 = uVar26 + 1;
              pvVar23 = (void *)((long)pvVar23 + lVar22 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
            } while (uVar26 != uVar2);
          }
          local_d8 = local_d8 + 1;
        } while (local_d8 != uVar16);
        return 0;
      }
    }
    else if (((uVar17 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) goto LAB_0022a2f7;
    Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
    pvVar13 = this_00->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    sVar7 = this_00->cstep;
    if ((long)this_00->c * sVar7 == 0) {
      return -100;
    }
    if ((int)uVar3 < 1) {
      return 0;
    }
    pvVar15 = pMVar6->data;
    sVar8 = pMVar6->elemsize;
    sVar9 = pMVar6->cstep;
    pvVar23 = pMVar6[1].data;
    sVar10 = pMVar6[1].elemsize;
    sVar11 = this_00->elemsize;
    sVar12 = pMVar6[1].cstep;
    uVar17 = 0;
    do {
      if (0 < (int)uVar20) {
        uVar18 = 0;
        do {
          fVar31 = *(float *)((long)pvVar23 + uVar18 * 4);
          fVar32 = *(float *)((long)pvVar15 + sVar8 * sVar9 * uVar17);
          if (fVar32 <= fVar31) {
            fVar31 = fVar32;
          }
          *(float *)((long)pvVar13 + uVar18 * 4) = fVar31;
          uVar18 = uVar18 + 1;
        } while (uVar20 != uVar18);
      }
      uVar17 = uVar17 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
      pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
    } while (uVar17 != uVar24);
    return 0;
  case 6:
    uVar1 = pMVar6->w;
    lVar28 = (long)(int)uVar1;
    uVar18 = (ulong)uVar1;
    sVar7 = pMVar6->elemsize;
    uVar26 = pMVar6[1].w;
    lVar22 = (long)(int)uVar26;
    uVar17 = (ulong)uVar26;
    uVar2 = pMVar6[1].h;
    uVar3 = pMVar6[1].c;
    uVar24 = (ulong)uVar3;
    uVar20 = uVar2 * uVar26;
    iVar25 = pMVar6->dims;
    if (iVar25 == 1) {
      iVar25 = pMVar6[1].dims;
      if (uVar1 != 1) {
        if (iVar25 == 1) {
          Mat::create(this_00,uVar1,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar6[1].w != 1) {
            if ((int)uVar1 < 1) {
              return 0;
            }
            pvVar15 = pMVar6->data;
            pvVar23 = pMVar6[1].data;
            uVar24 = 0;
            do {
              fVar31 = powf(*(float *)((long)pvVar15 + uVar24 * 4),
                            *(float *)((long)pvVar23 + uVar24 * 4));
              *(float *)((long)pvVar13 + uVar24 * 4) = fVar31;
              uVar24 = uVar24 + 1;
            } while (uVar18 != uVar24);
            return 0;
          }
          if ((int)uVar1 < 1) {
            return 0;
          }
          fVar31 = *pMVar6[1].data;
          pvVar15 = pMVar6->data;
          uVar24 = 0;
          do {
            fVar32 = powf(*(float *)((long)pvVar15 + uVar24 * 4),fVar31);
            *(float *)((long)pvVar13 + uVar24 * 4) = fVar32;
            uVar24 = uVar24 + 1;
          } while (uVar18 != uVar24);
          return 0;
        }
        if (iVar25 == 2) {
          Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          uVar24 = 0;
          do {
            if (0 < (int)uVar26) {
              fVar31 = *(float *)((long)pvVar15 + uVar24 * 4);
              uVar18 = 0;
              do {
                fVar32 = powf(fVar31,*(float *)((long)pvVar23 + uVar18 * 4));
                *(float *)((long)pvVar13 + uVar18 * 4) = fVar32;
                uVar18 = uVar18 + 1;
              } while (uVar17 != uVar18);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar22 * 4);
            pvVar23 = (void *)((long)pvVar23 + lVar22 * 4);
          } while (uVar24 != uVar2);
          return 0;
        }
        if (iVar25 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 != (void *)0x0) {
          local_d8 = (ulong)uVar20;
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          sVar8 = pMVar6[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar20) {
              fVar31 = *(float *)((long)pvVar15 + uVar17 * 4);
              uVar18 = 0;
              do {
                fVar32 = powf(fVar31,*(float *)((long)pvVar23 + uVar18 * 4));
                *(float *)((long)pvVar13 + uVar18 * 4) = fVar32;
                uVar18 = uVar18 + 1;
              } while (local_d8 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
          } while (uVar17 != uVar24);
          return 0;
        }
        return -100;
      }
      if (iVar25 == 1) {
        Mat::create(this_00,uVar26,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar26 < 1) {
          return 0;
        }
        fVar31 = *pMVar6->data;
        pvVar15 = pMVar6[1].data;
        uVar24 = 0;
        do {
          fVar32 = powf(fVar31,*(float *)((long)pvVar15 + uVar24 * 4));
          *(float *)((long)pvVar13 + uVar24 * 4) = fVar32;
          uVar24 = uVar24 + 1;
        } while (uVar17 != uVar24);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar20 < 1) {
          return 0;
        }
        fVar31 = *pMVar6->data;
        pvVar15 = pMVar6[1].data;
        uVar24 = 0;
        do {
          fVar32 = powf(fVar31,*(float *)((long)pvVar15 + uVar24 * 4));
          *(float *)((long)pvVar13 + uVar24 * 4) = fVar32;
          uVar24 = uVar24 + 1;
        } while (uVar20 != uVar24);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      local_d8 = (ulong)uVar20;
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar3 < 1) {
        return 0;
      }
      fVar31 = *pMVar6->data;
      pvVar15 = pMVar6[1].data;
      sVar8 = pMVar6[1].elemsize;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6[1].cstep;
      uVar17 = 0;
      do {
        if (0 < (int)uVar20) {
          uVar18 = 0;
          do {
            fVar32 = powf(fVar31,*(float *)((long)pvVar15 + uVar18 * 4));
            *(float *)((long)pvVar13 + uVar18 * 4) = fVar32;
            uVar18 = uVar18 + 1;
          } while (local_d8 != uVar18);
        }
        uVar17 = uVar17 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      } while (uVar17 != uVar24);
      return 0;
    }
    uVar4 = pMVar6->h;
    uVar21 = (ulong)uVar4;
    uVar14 = uVar4 * uVar1;
    if (iVar25 == 2) {
      if (pMVar6[1].dims == 3) {
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        local_60 = this_00->data;
        if (local_60 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        local_38 = pMVar6->data;
        local_58 = pMVar6[1].data;
        local_40 = (void *)((long)pMVar6->w * pMVar6->elemsize);
        local_48 = (void *)(this_00->cstep * this_00->elemsize);
        local_68 = (Mat *)(pMVar6[1].elemsize * pMVar6[1].cstep);
        local_70 = 0;
        do {
          pvVar13 = local_38;
          if (0 < (int)uVar2) {
            lVar28 = (long)local_40 * local_70;
            uVar18 = 0;
            pvVar15 = local_58;
            pvVar23 = local_60;
            do {
              if (0 < (int)uVar26) {
                fVar31 = *(float *)((long)pvVar13 + uVar18 * 4 + lVar28);
                uVar21 = 0;
                do {
                  fVar32 = powf(fVar31,*(float *)((long)pvVar15 + uVar21 * 4));
                  *(float *)((long)pvVar23 + uVar21 * 4) = fVar32;
                  uVar21 = uVar21 + 1;
                } while (uVar17 != uVar21);
              }
              uVar18 = uVar18 + 1;
              pvVar23 = (void *)((long)pvVar23 + lVar22 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
            } while (uVar18 != uVar2);
          }
          local_70 = local_70 + 1;
          local_60 = (void *)((long)local_60 + (long)local_48);
          local_58 = (void *)((long)local_58 + (long)local_68);
        } while (local_70 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          fVar31 = powf(*(float *)((long)pvVar15 + uVar24 * 4),
                        *(float *)((long)pvVar23 + uVar24 * 4));
          *(float *)((long)pvVar13 + uVar24 * 4) = fVar31;
          uVar24 = uVar24 + 1;
        } while (uVar14 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          if (0 < (int)uVar1) {
            fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
            uVar17 = 0;
            do {
              fVar32 = powf(*(float *)((long)pvVar15 + uVar17 * 4),fVar31);
              *(float *)((long)pvVar13 + uVar17 * 4) = fVar32;
              uVar17 = uVar17 + 1;
            } while (uVar18 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar28 * 4);
          pvVar15 = (void *)((long)pvVar15 + lVar28 * 4);
        } while (uVar24 != uVar21);
        return 0;
      }
      if ((int)uVar14 < 1) {
        return 0;
      }
      fVar31 = *pMVar6[1].data;
      pvVar15 = pMVar6->data;
      uVar24 = 0;
      do {
        fVar32 = powf(*(float *)((long)pvVar15 + uVar24 * 4),fVar31);
        *(float *)((long)pvVar13 + uVar24 * 4) = fVar32;
        uVar24 = uVar24 + 1;
      } while (uVar14 != uVar24);
      return 0;
    }
    if (iVar25 != 3) {
      return 0;
    }
    uVar5 = pMVar6->c;
    uVar16 = (ulong)uVar5;
    local_70 = uVar16;
    if (pMVar6[1].dims != 3) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      local_c0 = this_00->data;
      if (local_c0 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        local_48 = pMVar6->data;
        local_38 = (void *)((long)pMVar6[1].w * pMVar6[1].elemsize);
        local_40 = pMVar6[1].data;
        local_58 = (void *)(sVar7 * this_00->elemsize);
        local_68 = (Mat *)(pMVar6->elemsize * pMVar6->cstep);
        local_60 = (void *)0x0;
        do {
          pvVar13 = local_40;
          if (0 < (int)uVar4) {
            lVar22 = (long)local_38 * (long)local_60;
            uVar24 = 0;
            pvVar15 = local_c0;
            pvVar23 = local_48;
            do {
              if (0 < (int)uVar1) {
                fVar31 = *(float *)((long)pvVar13 + uVar24 * 4 + lVar22);
                uVar17 = 0;
                do {
                  fVar32 = powf(*(float *)((long)pvVar23 + uVar17 * 4),fVar31);
                  *(float *)((long)pvVar15 + uVar17 * 4) = fVar32;
                  uVar17 = uVar17 + 1;
                } while (uVar18 != uVar17);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar28 * 4);
              pvVar23 = (void *)((long)pvVar23 + lVar28 * 4);
            } while (uVar24 != uVar21);
          }
          local_60 = (void *)((long)local_60 + 1);
          local_c0 = (void *)((long)local_c0 + (long)local_58);
          local_48 = (void *)((long)local_48 + (long)local_68);
        } while (local_60 != (void *)local_70);
        return 0;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar13 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar15 = pMVar6[1].data;
        local_58 = (void *)(sVar7 * this_00->elemsize);
        sVar7 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar31 = *(float *)((long)pvVar15 + uVar24 * 4);
            uVar17 = 0;
            do {
              fVar32 = powf(*(float *)((long)pvVar13 + uVar17 * 4),fVar31);
              *(float *)((long)local_c0 + uVar17 * 4) = fVar32;
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          local_c0 = (void *)((long)local_c0 + (long)local_58);
          pvVar13 = (void *)((long)pvVar13 + sVar8 * sVar7);
        } while (uVar24 != local_70);
        return 0;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      fVar31 = *pMVar6[1].data;
      pvVar13 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      local_58 = (void *)(sVar7 * this_00->elemsize);
      sVar7 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            fVar32 = powf(*(float *)((long)pvVar13 + uVar17 * 4),fVar31);
            *(float *)((long)local_c0 + uVar17 * 4) = fVar32;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        local_c0 = (void *)((long)local_c0 + (long)local_58);
        pvVar13 = (void *)((long)pvVar13 + sVar8 * sVar7);
      } while (uVar24 != local_70);
      return 0;
    }
    if (((uVar26 == 1) && (uVar2 == 1)) && (uVar3 == uVar5)) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      pvVar23 = pMVar6[1].data;
      sVar9 = pMVar6[1].elemsize;
      sVar10 = pMVar6[1].cstep;
      sVar11 = this_00->elemsize;
      sVar12 = pMVar6->cstep;
      local_e0 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar24 = 0;
          do {
            fVar31 = powf(*(float *)((long)pvVar15 + uVar24 * 4),
                          *(float *)((long)pvVar23 + sVar9 * sVar10 * local_e0));
            *(float *)((long)pvVar13 + uVar24 * 4) = fVar31;
            uVar24 = uVar24 + 1;
          } while (uVar14 != uVar24);
        }
        local_e0 = local_e0 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
      } while (local_e0 != local_70);
      return 0;
    }
    if (uVar26 == uVar1) {
      if (uVar3 == 1 && uVar4 == uVar2) {
        Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar17 = 0;
            do {
              fVar31 = powf(*(float *)((long)pvVar15 + uVar17 * 4),
                            *(float *)((long)pvVar23 + uVar17 * 4));
              *(float *)((long)pvVar13 + uVar17 * 4) = fVar31;
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        } while (uVar24 != local_70);
        return 0;
      }
      if (((uVar18 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) {
        if (uVar5 == 1 && uVar4 == uVar2) {
          Mat::create(this_00,uVar1,uVar4,uVar3,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          local_d8 = (ulong)uVar20;
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          sVar8 = pMVar6[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar20) {
              uVar18 = 0;
              do {
                fVar31 = powf(*(float *)((long)pvVar15 + uVar18 * 4),
                              *(float *)((long)pvVar23 + uVar18 * 4));
                *(float *)((long)pvVar13 + uVar18 * 4) = fVar31;
                uVar18 = uVar18 + 1;
              } while (local_d8 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
          } while (uVar17 != uVar24);
          return 0;
        }
LAB_0022a5f2:
        if ((((uVar1 != 1) && (uVar26 == 1)) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          local_60 = this_00->data;
          if (local_60 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          local_58 = pMVar6->data;
          local_38 = (void *)(pMVar6[1].elemsize * pMVar6[1].cstep);
          local_40 = pMVar6[1].data;
          local_48 = (void *)(this_00->cstep * this_00->elemsize);
          local_68 = (Mat *)(pMVar6->elemsize * pMVar6->cstep);
          local_c0 = (void *)0x0;
          do {
            pvVar13 = local_40;
            if (0 < (int)uVar4) {
              lVar22 = (long)local_38 * (long)local_c0;
              uVar24 = 0;
              pvVar15 = local_58;
              pvVar23 = local_60;
              do {
                if (0 < (int)uVar1) {
                  fVar31 = *(float *)((long)pvVar13 + uVar24 * 4 + lVar22);
                  uVar17 = 0;
                  do {
                    fVar32 = powf(*(float *)((long)pvVar15 + uVar17 * 4),fVar31);
                    *(float *)((long)pvVar23 + uVar17 * 4) = fVar32;
                    uVar17 = uVar17 + 1;
                  } while (uVar18 != uVar17);
                }
                uVar24 = uVar24 + 1;
                pvVar23 = (void *)((long)pvVar23 + lVar28 * 4);
                pvVar15 = (void *)((long)pvVar15 + lVar28 * 4);
              } while (uVar24 != uVar21);
            }
            local_c0 = (void *)((long)local_c0 + 1);
            local_60 = (void *)((long)local_60 + (long)local_48);
            local_58 = (void *)((long)local_58 + (long)local_68);
          } while (local_c0 != (void *)local_70);
          return 0;
        }
        if (((uVar26 == uVar1) && (uVar4 != 1)) && ((uVar2 == 1 && (uVar3 == uVar5)))) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          local_c0 = this_00->data;
          if (local_c0 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          local_60 = pMVar6->data;
          pvVar13 = pMVar6[1].data;
          local_58 = (void *)(this_00->cstep * this_00->elemsize);
          local_68 = (Mat *)(pMVar6[1].elemsize * pMVar6[1].cstep);
          local_48 = (void *)(pMVar6->elemsize * pMVar6->cstep);
          local_c8 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar26 = 0;
              pvVar15 = local_60;
              pvVar23 = local_c0;
              do {
                if (0 < (int)uVar1) {
                  uVar24 = 0;
                  do {
                    fVar31 = powf(*(float *)((long)pvVar15 + uVar24 * 4),
                                  *(float *)((long)pvVar13 + uVar24 * 4));
                    *(float *)((long)pvVar23 + uVar24 * 4) = fVar31;
                    uVar24 = uVar24 + 1;
                  } while (uVar18 != uVar24);
                }
                uVar26 = uVar26 + 1;
                pvVar23 = (void *)((long)pvVar23 + lVar28 * 4);
                pvVar15 = (void *)((long)pvVar15 + lVar28 * 4);
              } while (uVar26 != uVar4);
            }
            local_c8 = local_c8 + 1;
            local_c0 = (void *)((long)local_c0 + (long)local_58);
            pvVar13 = (void *)((long)pvVar13 + (long)local_68);
            local_60 = (void *)((long)local_60 + (long)local_48);
          } while (local_c8 != local_70);
          return 0;
        }
        if (((uVar18 == 1 && uVar26 != 1) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar26,uVar4,uVar5,sVar7,opt->blob_allocator);
          local_60 = this_00->data;
          if (local_60 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_70 < 1) {
            return 0;
          }
          local_38 = pMVar6->data;
          local_40 = (void *)(pMVar6->elemsize * pMVar6->cstep);
          local_58 = pMVar6[1].data;
          local_48 = (void *)(this_00->cstep * this_00->elemsize);
          local_68 = (Mat *)(pMVar6[1].elemsize * pMVar6[1].cstep);
          local_c0 = (void *)0x0;
          do {
            pvVar13 = local_38;
            if (0 < (int)uVar4) {
              lVar28 = (long)local_40 * (long)local_c0;
              uVar24 = 0;
              pvVar15 = local_60;
              pvVar23 = local_58;
              do {
                if (0 < (int)uVar26) {
                  fVar31 = *(float *)((long)pvVar13 + uVar24 * 4 + lVar28);
                  uVar18 = 0;
                  do {
                    fVar32 = powf(fVar31,*(float *)((long)pvVar23 + uVar18 * 4));
                    *(float *)((long)pvVar15 + uVar18 * 4) = fVar32;
                    uVar18 = uVar18 + 1;
                  } while (uVar17 != uVar18);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
                pvVar23 = (void *)((long)pvVar23 + lVar22 * 4);
              } while (uVar24 != uVar21);
            }
            local_c0 = (void *)((long)local_c0 + 1);
            local_60 = (void *)((long)local_60 + (long)local_48);
            local_58 = (void *)((long)local_58 + (long)local_68);
          } while (local_c0 != (void *)local_70);
          return 0;
        }
        if (((uVar2 == 1 || uVar21 != 1) || uVar26 != uVar1) || (uVar3 != uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          if (local_68->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_68->c * local_68->cstep == 0) {
            return -100;
          }
          if ((int)local_70 < 1) {
            return 0;
          }
          local_e0 = 0;
          do {
            pMVar6 = local_50;
            bVar30 = local_50->dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_50->d;
            }
            local_b8.w = local_50->w;
            local_b8.h = local_50->h;
            local_b8.dims = bVar30 ^ 3;
            sVar7 = local_50->cstep;
            pvVar13 = local_50->data;
            sVar8 = local_50->elemsize;
            local_b8.data = (void *)(sVar7 * local_e0 * sVar8 + (long)pvVar13);
            local_b8.elempack = local_50->elempack;
            local_b8.allocator = local_50->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar8;
            Mat::~Mat(&local_b8);
            bVar30 = pMVar6[1].dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = pMVar6[1].d;
            }
            local_b8.w = pMVar6[1].w;
            local_b8.h = pMVar6[1].h;
            local_b8.dims = bVar30 ^ 3;
            sVar9 = pMVar6[1].cstep;
            pvVar15 = pMVar6[1].data;
            local_b8.elemsize = pMVar6[1].elemsize;
            local_b8.data = (void *)(sVar9 * local_e0 * local_b8.elemsize + (long)pvVar15);
            local_b8.elempack = pMVar6[1].elempack;
            local_b8.allocator = pMVar6[1].allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_60 = (void *)local_b8.elemsize;
            Mat::~Mat(&local_b8);
            bVar30 = local_68->dims == 3;
            local_b8.w = local_68->w;
            local_b8.h = local_68->h;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_68->d;
            }
            local_b8.dims = bVar30 ^ 3;
            sVar10 = local_68->cstep;
            pvVar23 = local_68->data;
            sVar11 = local_68->elemsize;
            local_b8.data = (void *)(sVar10 * local_e0 * sVar11 + (long)pvVar23);
            local_b8.elempack = local_68->elempack;
            local_b8.allocator = local_68->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar11;
            Mat::~Mat(&local_b8);
            if (0 < (int)uVar14) {
              lVar22 = sVar9 * (long)local_60;
              uVar24 = 0;
              do {
                fVar31 = powf(*(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_e0),
                              *(float *)((long)pvVar15 + uVar24 * 4 + lVar22 * local_e0));
                *(float *)((long)pvVar23 + uVar24 * 4 + sVar10 * sVar11 * local_e0) = fVar31;
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            local_e0 = local_e0 + 1;
          } while (local_e0 != local_70);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar2,uVar5,sVar7,opt->blob_allocator);
        if (local_68->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_68->c * local_68->cstep == 0) {
          return -100;
        }
        if ((int)local_70 < 1) {
          return 0;
        }
        local_c8 = 0;
        do {
          pMVar6 = local_50;
          bVar30 = local_50->dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_50->d;
          }
          local_b8.w = local_50->w;
          local_b8.h = local_50->h;
          local_b8.dims = bVar30 ^ 3;
          sVar7 = local_50->cstep;
          pvVar13 = local_50->data;
          local_b8.elemsize = local_50->elemsize;
          local_b8.data = (void *)(sVar7 * local_c8 * local_b8.elemsize + (long)pvVar13);
          local_b8.elempack = local_50->elempack;
          local_b8.allocator = local_50->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_60 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          bVar30 = pMVar6[1].dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = pMVar6[1].d;
          }
          local_b8.w = pMVar6[1].w;
          local_b8.h = pMVar6[1].h;
          local_b8.dims = bVar30 ^ 3;
          local_58 = (void *)pMVar6[1].cstep;
          pvVar15 = pMVar6[1].data;
          local_b8.elemsize = pMVar6[1].elemsize;
          local_b8.data = (void *)((long)local_58 * local_c8 * local_b8.elemsize + (long)pvVar15);
          local_b8.elempack = pMVar6[1].elempack;
          local_b8.allocator = pMVar6[1].allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_48 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          bVar30 = local_68->dims == 3;
          local_b8.w = local_68->w;
          local_b8.h = local_68->h;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_68->d;
          }
          local_b8.dims = bVar30 ^ 3;
          sVar8 = local_68->cstep;
          pvVar23 = local_68->data;
          sVar9 = local_68->elemsize;
          local_b8.data = (void *)(sVar8 * local_c8 * sVar9 + (long)pvVar23);
          local_b8.elempack = local_68->elempack;
          local_b8.allocator = local_68->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_b8.elemsize = sVar9;
          Mat::~Mat(&local_b8);
          if (0 < (int)uVar2) {
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar9 * local_c8);
            pvVar15 = (void *)((long)pvVar15 + (long)local_58 * (long)local_48 * local_c8);
            lVar22 = sVar7 * (long)local_60;
            uVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                uVar24 = 0;
                do {
                  fVar31 = powf(*(float *)((long)pvVar13 + uVar24 * 4 + lVar22 * local_c8),
                                *(float *)((long)pvVar15 + uVar24 * 4));
                  *(float *)((long)pvVar23 + uVar24 * 4) = fVar31;
                  uVar24 = uVar24 + 1;
                } while (uVar18 != uVar24);
              }
              uVar26 = uVar26 + 1;
              pvVar23 = (void *)((long)pvVar23 + lVar28 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar28 * 4);
            } while (uVar26 != uVar2);
          }
          local_c8 = local_c8 + 1;
        } while (local_c8 != local_70);
        return 0;
      }
    }
    else if (((uVar18 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) goto LAB_0022a5f2;
    Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
    pvVar13 = this_00->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    local_d8 = (ulong)uVar20;
    sVar7 = this_00->cstep;
    if ((long)this_00->c * sVar7 == 0) {
      return -100;
    }
    if ((int)uVar3 < 1) {
      return 0;
    }
    pvVar15 = pMVar6->data;
    local_70 = pMVar6->elemsize * pMVar6->cstep;
    pvVar23 = pMVar6[1].data;
    sVar8 = pMVar6[1].elemsize;
    sVar9 = this_00->elemsize;
    sVar10 = pMVar6[1].cstep;
    local_e0 = 0;
    do {
      if (0 < (int)uVar20) {
        lVar22 = local_70 * local_e0;
        uVar17 = 0;
        do {
          fVar31 = powf(*(float *)((long)pvVar15 + lVar22),*(float *)((long)pvVar23 + uVar17 * 4));
          *(float *)((long)pvVar13 + uVar17 * 4) = fVar31;
          uVar17 = uVar17 + 1;
        } while (local_d8 != uVar17);
      }
      local_e0 = local_e0 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
      pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
    } while (local_e0 != uVar24);
    return 0;
  case 7:
    uVar1 = pMVar6->w;
    lVar22 = (long)(int)uVar1;
    uVar17 = (ulong)uVar1;
    sVar7 = pMVar6->elemsize;
    uVar26 = pMVar6[1].w;
    lVar28 = (long)(int)uVar26;
    uVar18 = (ulong)uVar26;
    uVar2 = pMVar6[1].h;
    uVar3 = pMVar6[1].c;
    uVar24 = (ulong)uVar3;
    uVar20 = uVar2 * uVar26;
    iVar25 = pMVar6->dims;
    if (iVar25 == 1) {
      iVar25 = pMVar6[1].dims;
      if (uVar1 != 1) {
        if (iVar25 == 1) {
          Mat::create(this_00,uVar1,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar6[1].w != 1) {
            if ((int)uVar1 < 1) {
              return 0;
            }
            pvVar15 = pMVar6->data;
            pvVar23 = pMVar6[1].data;
            uVar24 = 0;
            do {
              *(float *)((long)pvVar13 + uVar24 * 4) =
                   *(float *)((long)pvVar23 + uVar24 * 4) - *(float *)((long)pvVar15 + uVar24 * 4);
              uVar24 = uVar24 + 1;
            } while (uVar17 != uVar24);
            return 0;
          }
          if ((int)uVar1 < 1) {
            return 0;
          }
          fVar31 = *pMVar6[1].data;
          pvVar15 = pMVar6->data;
          uVar24 = 0;
          do {
            *(float *)((long)pvVar13 + uVar24 * 4) = fVar31 - *(float *)((long)pvVar15 + uVar24 * 4)
            ;
            uVar24 = uVar24 + 1;
          } while (uVar17 != uVar24);
          return 0;
        }
        if (iVar25 == 2) {
          Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          uVar24 = 0;
          do {
            if (0 < (int)uVar26) {
              fVar31 = *(float *)((long)pvVar15 + uVar24 * 4);
              uVar17 = 0;
              do {
                *(float *)((long)pvVar13 + uVar17 * 4) =
                     *(float *)((long)pvVar23 + uVar17 * 4) - fVar31;
                uVar17 = uVar17 + 1;
              } while (uVar18 != uVar17);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar28 * 4);
            pvVar23 = (void *)((long)pvVar23 + lVar28 * 4);
          } while (uVar24 != uVar2);
          return 0;
        }
        if (iVar25 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 != (void *)0x0) {
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          sVar8 = pMVar6[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar20) {
              fVar31 = *(float *)((long)pvVar15 + uVar17 * 4);
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar23 + uVar18 * 4) - fVar31;
                uVar18 = uVar18 + 1;
              } while (uVar20 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
          } while (uVar17 != uVar24);
          return 0;
        }
        return -100;
      }
      if (iVar25 == 1) {
        Mat::create(this_00,uVar26,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar26 < 1) {
          return 0;
        }
        fVar31 = *pMVar6->data;
        pvVar15 = pMVar6[1].data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) = *(float *)((long)pvVar15 + uVar24 * 4) - fVar31;
          uVar24 = uVar24 + 1;
        } while (uVar18 != uVar24);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar20 < 1) {
          return 0;
        }
        fVar31 = *pMVar6->data;
        pvVar15 = pMVar6[1].data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) = *(float *)((long)pvVar15 + uVar24 * 4) - fVar31;
          uVar24 = uVar24 + 1;
        } while (uVar20 != uVar24);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar3 < 1) {
        return 0;
      }
      fVar31 = *pMVar6->data;
      pvVar15 = pMVar6[1].data;
      sVar8 = pMVar6[1].elemsize;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6[1].cstep;
      uVar17 = 0;
      do {
        if (0 < (int)uVar20) {
          uVar18 = 0;
          do {
            *(float *)((long)pvVar13 + uVar18 * 4) = *(float *)((long)pvVar15 + uVar18 * 4) - fVar31
            ;
            uVar18 = uVar18 + 1;
          } while (uVar20 != uVar18);
        }
        uVar17 = uVar17 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      } while (uVar17 != uVar24);
      return 0;
    }
    uVar4 = pMVar6->h;
    uVar21 = (ulong)uVar4;
    uVar14 = uVar4 * uVar1;
    if (iVar25 == 2) {
      if (pMVar6[1].dims == 3) {
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        iVar25 = pMVar6->w;
        sVar8 = pMVar6->elemsize;
        sVar9 = pMVar6[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar6[1].cstep;
        uVar17 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar21 = 0;
            pvVar19 = pvVar23;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar26) {
                fVar31 = *(float *)((long)pvVar15 + uVar21 * 4 + (long)iVar25 * sVar8 * uVar17);
                uVar16 = 0;
                do {
                  *(float *)((long)pvVar29 + uVar16 * 4) =
                       *(float *)((long)pvVar19 + uVar16 * 4) - fVar31;
                  uVar16 = uVar16 + 1;
                } while (uVar18 != uVar16);
              }
              uVar21 = uVar21 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
            } while (uVar21 != uVar2);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
          pvVar23 = (void *)((long)pvVar23 + sVar9 * sVar11);
        } while (uVar17 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) =
               *(float *)((long)pvVar23 + uVar24 * 4) - *(float *)((long)pvVar15 + uVar24 * 4);
          uVar24 = uVar24 + 1;
        } while (uVar14 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          if (0 < (int)uVar1) {
            fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   fVar31 - *(float *)((long)pvVar15 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar17 != uVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar22 * 4);
          pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
        } while (uVar24 != uVar21);
        return 0;
      }
      if ((int)uVar14 < 1) {
        return 0;
      }
      fVar31 = *pMVar6[1].data;
      pvVar15 = pMVar6->data;
      uVar24 = 0;
      do {
        *(float *)((long)pvVar13 + uVar24 * 4) = fVar31 - *(float *)((long)pvVar15 + uVar24 * 4);
        uVar24 = uVar24 + 1;
      } while (uVar14 != uVar24);
      return 0;
    }
    if (iVar25 != 3) {
      return 0;
    }
    uVar5 = pMVar6->c;
    uVar16 = (ulong)uVar5;
    if (pMVar6[1].dims != 3) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        iVar25 = pMVar6[1].w;
        sVar9 = pMVar6[1].elemsize;
        pvVar23 = pMVar6[1].data;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar4) {
            uVar18 = 0;
            pvVar19 = pvVar15;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar1) {
                fVar31 = *(float *)((long)pvVar23 + uVar18 * 4 + (long)iVar25 * sVar9 * uVar24);
                uVar27 = 0;
                do {
                  *(float *)((long)pvVar29 + uVar27 * 4) =
                       fVar31 - *(float *)((long)pvVar19 + uVar27 * 4);
                  uVar27 = uVar27 + 1;
                } while (uVar17 != uVar27);
              }
              uVar18 = uVar18 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
            } while (uVar18 != uVar21);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   fVar31 - *(float *)((long)pvVar15 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        } while (uVar24 != uVar16);
        return 0;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      fVar31 = *pMVar6[1].data;
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) = fVar31 - *(float *)((long)pvVar15 + uVar17 * 4)
            ;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (((uVar26 == 1) && (uVar2 == 1)) && (uVar3 == uVar5)) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      pvVar23 = pMVar6[1].data;
      sVar9 = pMVar6[1].elemsize;
      sVar10 = pMVar6[1].cstep;
      sVar11 = this_00->elemsize;
      sVar12 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) =
                 *(float *)((long)pvVar23 + sVar9 * sVar10 * uVar24) -
                 *(float *)((long)pvVar15 + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (uVar26 == uVar1) {
      if (uVar3 == 1 && uVar4 == uVar2) {
        Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar23 + uVar17 * 4) - *(float *)((long)pvVar15 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (((uVar17 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) {
        if (uVar5 == 1 && uVar4 == uVar2) {
          Mat::create(this_00,uVar1,uVar4,uVar3,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          sVar8 = pMVar6[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar20) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar23 + uVar18 * 4) - *(float *)((long)pvVar15 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar20 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
          } while (uVar17 != uVar24);
          return 0;
        }
LAB_00229a70:
        if ((((uVar1 != 1) && (uVar26 == 1)) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          sVar9 = pMVar6[1].elemsize;
          sVar10 = pMVar6[1].cstep;
          pvVar23 = pMVar6[1].data;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar6->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar18 = 0;
              pvVar19 = pvVar15;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar1) {
                  fVar31 = *(float *)((long)pvVar23 + uVar18 * 4 + sVar9 * sVar10 * uVar24);
                  uVar27 = 0;
                  do {
                    *(float *)((long)pvVar29 + uVar27 * 4) =
                         fVar31 - *(float *)((long)pvVar19 + uVar27 * 4);
                    uVar27 = uVar27 + 1;
                  } while (uVar17 != uVar27);
                }
                uVar18 = uVar18 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
              } while (uVar18 != uVar21);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar26 == uVar1) && (uVar4 != 1)) && ((uVar2 == 1 && (uVar3 == uVar5)))) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          pvVar23 = pMVar6[1].data;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = pMVar6[1].cstep;
          sVar12 = pMVar6->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar26 = 0;
              pvVar19 = pvVar15;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar1) {
                  uVar18 = 0;
                  do {
                    *(float *)((long)pvVar29 + uVar18 * 4) =
                         *(float *)((long)pvVar23 + uVar18 * 4) -
                         *(float *)((long)pvVar19 + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar17 != uVar18);
                }
                uVar26 = uVar26 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
              } while (uVar26 != uVar4);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar11);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar17 == 1 && uVar26 != 1) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar26,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          sVar9 = pMVar6->cstep;
          pvVar23 = pMVar6[1].data;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar6[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar17 = 0;
              pvVar19 = pvVar23;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar26) {
                  fVar31 = *(float *)((long)pvVar15 + uVar17 * 4 + sVar8 * sVar9 * uVar24);
                  uVar27 = 0;
                  do {
                    *(float *)((long)pvVar29 + uVar27 * 4) =
                         *(float *)((long)pvVar19 + uVar27 * 4) - fVar31;
                    uVar27 = uVar27 + 1;
                  } while (uVar18 != uVar27);
                }
                uVar17 = uVar17 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
              } while (uVar17 != uVar21);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
            pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar2 == 1 || uVar21 != 1) || uVar26 != uVar1) || (uVar3 != uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          if (local_68->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_68->c * local_68->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          local_e0 = 0;
          do {
            pMVar6 = local_50;
            bVar30 = local_50->dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_50->d;
            }
            local_b8.w = local_50->w;
            local_b8.h = local_50->h;
            local_b8.dims = bVar30 ^ 3;
            sVar7 = local_50->cstep;
            pvVar13 = local_50->data;
            sVar8 = local_50->elemsize;
            local_b8.data = (void *)(sVar7 * local_e0 * sVar8 + (long)pvVar13);
            local_b8.elempack = local_50->elempack;
            local_b8.allocator = local_50->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar8;
            Mat::~Mat(&local_b8);
            bVar30 = pMVar6[1].dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = pMVar6[1].d;
            }
            local_b8.w = pMVar6[1].w;
            local_b8.h = pMVar6[1].h;
            local_b8.dims = bVar30 ^ 3;
            local_70 = pMVar6[1].cstep;
            pvVar15 = pMVar6[1].data;
            local_b8.elemsize = pMVar6[1].elemsize;
            local_b8.data = (void *)(local_70 * local_e0 * local_b8.elemsize + (long)pvVar15);
            local_b8.elempack = pMVar6[1].elempack;
            local_b8.allocator = pMVar6[1].allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_60 = (void *)local_b8.elemsize;
            Mat::~Mat(&local_b8);
            bVar30 = local_68->dims == 3;
            local_b8.w = local_68->w;
            local_b8.h = local_68->h;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_68->d;
            }
            local_b8.dims = bVar30 ^ 3;
            sVar9 = local_68->cstep;
            pvVar23 = local_68->data;
            sVar10 = local_68->elemsize;
            local_b8.data = (void *)(sVar9 * local_e0 * sVar10 + (long)pvVar23);
            local_b8.elempack = local_68->elempack;
            local_b8.allocator = local_68->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar10;
            Mat::~Mat(&local_b8);
            if (0 < (int)uVar14) {
              uVar24 = 0;
              do {
                *(float *)((long)pvVar23 + uVar24 * 4 + sVar9 * sVar10 * local_e0) =
                     *(float *)((long)pvVar15 + uVar24 * 4 + local_70 * (long)local_60 * local_e0) -
                     *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_e0);
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            local_e0 = local_e0 + 1;
          } while (local_e0 != uVar16);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar2,uVar5,sVar7,opt->blob_allocator);
        if (local_68->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_68->c * local_68->cstep == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        local_d8 = 0;
        do {
          pMVar6 = local_50;
          bVar30 = local_50->dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_50->d;
          }
          local_b8.w = local_50->w;
          local_b8.h = local_50->h;
          local_b8.dims = bVar30 ^ 3;
          sVar7 = local_50->cstep;
          pvVar13 = local_50->data;
          sVar8 = local_50->elemsize;
          local_b8.data = (void *)(sVar7 * local_d8 * sVar8 + (long)pvVar13);
          local_b8.elempack = local_50->elempack;
          local_b8.allocator = local_50->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_b8.elemsize = sVar8;
          Mat::~Mat(&local_b8);
          bVar30 = pMVar6[1].dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = pMVar6[1].d;
          }
          local_b8.w = pMVar6[1].w;
          local_b8.h = pMVar6[1].h;
          local_b8.dims = bVar30 ^ 3;
          local_70 = pMVar6[1].cstep;
          pvVar15 = pMVar6[1].data;
          local_b8.elemsize = pMVar6[1].elemsize;
          local_b8.data = (void *)(local_70 * local_d8 * local_b8.elemsize + (long)pvVar15);
          local_b8.elempack = pMVar6[1].elempack;
          local_b8.allocator = pMVar6[1].allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_60 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          bVar30 = local_68->dims == 3;
          local_b8.w = local_68->w;
          local_b8.h = local_68->h;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_68->d;
          }
          local_b8.dims = bVar30 ^ 3;
          local_58 = (void *)local_68->cstep;
          pvVar23 = local_68->data;
          local_b8.elemsize = local_68->elemsize;
          local_b8.data = (void *)((long)local_58 * local_d8 * local_b8.elemsize + (long)pvVar23);
          local_b8.elempack = local_68->elempack;
          local_b8.allocator = local_68->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_48 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          if (0 < (int)uVar2) {
            pvVar23 = (void *)((long)pvVar23 + (long)local_58 * (long)local_48 * local_d8);
            pvVar15 = (void *)((long)pvVar15 + local_70 * (long)local_60 * local_d8);
            uVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar23 + uVar24 * 4) =
                       *(float *)((long)pvVar15 + uVar24 * 4) -
                       *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_d8);
                  uVar24 = uVar24 + 1;
                } while (uVar17 != uVar24);
              }
              uVar26 = uVar26 + 1;
              pvVar23 = (void *)((long)pvVar23 + lVar22 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
            } while (uVar26 != uVar2);
          }
          local_d8 = local_d8 + 1;
        } while (local_d8 != uVar16);
        return 0;
      }
    }
    else if (((uVar17 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) goto LAB_00229a70;
    Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
    pvVar13 = this_00->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    sVar7 = this_00->cstep;
    if ((long)this_00->c * sVar7 == 0) {
      return -100;
    }
    if ((int)uVar3 < 1) {
      return 0;
    }
    pvVar15 = pMVar6->data;
    sVar8 = pMVar6->elemsize;
    sVar9 = pMVar6->cstep;
    pvVar23 = pMVar6[1].data;
    sVar10 = pMVar6[1].elemsize;
    sVar11 = this_00->elemsize;
    sVar12 = pMVar6[1].cstep;
    uVar17 = 0;
    do {
      if (0 < (int)uVar20) {
        uVar18 = 0;
        do {
          *(float *)((long)pvVar13 + uVar18 * 4) =
               *(float *)((long)pvVar23 + uVar18 * 4) -
               *(float *)((long)pvVar15 + sVar8 * sVar9 * uVar17);
          uVar18 = uVar18 + 1;
        } while (uVar20 != uVar18);
      }
      uVar17 = uVar17 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
      pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
    } while (uVar17 != uVar24);
    return 0;
  case 8:
    uVar1 = pMVar6->w;
    lVar22 = (long)(int)uVar1;
    uVar18 = (ulong)uVar1;
    sVar7 = pMVar6->elemsize;
    uVar26 = pMVar6[1].w;
    lVar28 = (long)(int)uVar26;
    uVar17 = (ulong)uVar26;
    uVar2 = pMVar6[1].h;
    uVar3 = pMVar6[1].c;
    uVar24 = (ulong)uVar3;
    uVar20 = uVar2 * uVar26;
    iVar25 = pMVar6->dims;
    if (iVar25 == 1) {
      iVar25 = pMVar6[1].dims;
      if (uVar1 != 1) {
        if (iVar25 == 1) {
          Mat::create(this_00,uVar1,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar6[1].w != 1) {
            if ((int)uVar1 < 1) {
              return 0;
            }
            pvVar15 = pMVar6->data;
            pvVar23 = pMVar6[1].data;
            uVar24 = 0;
            do {
              *(float *)((long)pvVar13 + uVar24 * 4) =
                   *(float *)((long)pvVar23 + uVar24 * 4) / *(float *)((long)pvVar15 + uVar24 * 4);
              uVar24 = uVar24 + 1;
            } while (uVar18 != uVar24);
            return 0;
          }
          if ((int)uVar1 < 1) {
            return 0;
          }
          fVar31 = *pMVar6[1].data;
          pvVar15 = pMVar6->data;
          uVar24 = 0;
          do {
            *(float *)((long)pvVar13 + uVar24 * 4) = fVar31 / *(float *)((long)pvVar15 + uVar24 * 4)
            ;
            uVar24 = uVar24 + 1;
          } while (uVar18 != uVar24);
          return 0;
        }
        if (iVar25 == 2) {
          Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          uVar24 = 0;
          do {
            if (0 < (int)uVar26) {
              fVar31 = *(float *)((long)pvVar15 + uVar24 * 4);
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar23 + uVar18 * 4) * (1.0 / fVar31);
                uVar18 = uVar18 + 1;
              } while (uVar17 != uVar18);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar28 * 4);
            pvVar23 = (void *)((long)pvVar23 + lVar28 * 4);
          } while (uVar24 != uVar2);
          return 0;
        }
        if (iVar25 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 != (void *)0x0) {
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          sVar8 = pMVar6[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar20) {
              fVar31 = *(float *)((long)pvVar15 + uVar17 * 4);
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar23 + uVar18 * 4) * (1.0 / fVar31);
                uVar18 = uVar18 + 1;
              } while (uVar20 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
          } while (uVar17 != uVar24);
          return 0;
        }
        return -100;
      }
      if (iVar25 == 1) {
        Mat::create(this_00,uVar26,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar26 < 1) {
          return 0;
        }
        pvVar15 = pMVar6[1].data;
        fVar31 = *pMVar6->data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) =
               *(float *)((long)pvVar15 + uVar24 * 4) * (1.0 / fVar31);
          uVar24 = uVar24 + 1;
        } while (uVar17 != uVar24);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar20 < 1) {
          return 0;
        }
        pvVar15 = pMVar6[1].data;
        fVar31 = *pMVar6->data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) =
               *(float *)((long)pvVar15 + uVar24 * 4) * (1.0 / fVar31);
          uVar24 = uVar24 + 1;
        } while (uVar20 != uVar24);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar3 < 1) {
        return 0;
      }
      pvVar15 = pMVar6[1].data;
      sVar8 = this_00->elemsize;
      sVar9 = pMVar6[1].elemsize;
      fVar31 = *pMVar6->data;
      sVar10 = pMVar6[1].cstep;
      uVar17 = 0;
      do {
        if (0 < (int)uVar20) {
          uVar18 = 0;
          do {
            *(float *)((long)pvVar13 + uVar18 * 4) =
                 *(float *)((long)pvVar15 + uVar18 * 4) * (1.0 / fVar31);
            uVar18 = uVar18 + 1;
          } while (uVar20 != uVar18);
        }
        uVar17 = uVar17 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar8);
        pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar10);
      } while (uVar17 != uVar24);
      return 0;
    }
    uVar4 = pMVar6->h;
    uVar21 = (ulong)uVar4;
    uVar14 = uVar4 * uVar1;
    if (iVar25 == 2) {
      if (pMVar6[1].dims == 3) {
        Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        iVar25 = pMVar6->w;
        sVar8 = pMVar6->elemsize;
        sVar9 = pMVar6[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar6[1].cstep;
        uVar18 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar21 = 0;
            pvVar19 = pvVar23;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar26) {
                fVar31 = *(float *)((long)pvVar15 + uVar21 * 4 + (long)iVar25 * sVar8 * uVar18);
                uVar16 = 0;
                do {
                  *(float *)((long)pvVar29 + uVar16 * 4) =
                       *(float *)((long)pvVar19 + uVar16 * 4) * (1.0 / fVar31);
                  uVar16 = uVar16 + 1;
                } while (uVar17 != uVar16);
              }
              uVar21 = uVar21 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
            } while (uVar21 != uVar2);
          }
          uVar18 = uVar18 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
          pvVar23 = (void *)((long)pvVar23 + sVar9 * sVar11);
        } while (uVar18 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) =
               *(float *)((long)pvVar23 + uVar24 * 4) / *(float *)((long)pvVar15 + uVar24 * 4);
          uVar24 = uVar24 + 1;
        } while (uVar14 != uVar24);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          if (0 < (int)uVar1) {
            fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   fVar31 / *(float *)((long)pvVar15 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar18 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar22 * 4);
          pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
        } while (uVar24 != uVar21);
        return 0;
      }
      if ((int)uVar14 < 1) {
        return 0;
      }
      fVar31 = *pMVar6[1].data;
      pvVar15 = pMVar6->data;
      uVar24 = 0;
      do {
        *(float *)((long)pvVar13 + uVar24 * 4) = fVar31 / *(float *)((long)pvVar15 + uVar24 * 4);
        uVar24 = uVar24 + 1;
      } while (uVar14 != uVar24);
      return 0;
    }
    if (iVar25 != 3) {
      return 0;
    }
    uVar5 = pMVar6->c;
    uVar16 = (ulong)uVar5;
    if (pMVar6[1].dims != 3) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        iVar25 = pMVar6[1].w;
        sVar9 = pMVar6[1].elemsize;
        pvVar23 = pMVar6[1].data;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar4) {
            uVar17 = 0;
            pvVar19 = pvVar15;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar1) {
                fVar31 = *(float *)((long)pvVar23 + uVar17 * 4 + (long)iVar25 * sVar9 * uVar24);
                uVar27 = 0;
                do {
                  *(float *)((long)pvVar29 + uVar27 * 4) =
                       fVar31 / *(float *)((long)pvVar19 + uVar27 * 4);
                  uVar27 = uVar27 + 1;
                } while (uVar18 != uVar27);
              }
              uVar17 = uVar17 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
            } while (uVar17 != uVar21);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (pMVar6[1].w != 1) {
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   fVar31 / *(float *)((long)pvVar15 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        } while (uVar24 != uVar16);
        return 0;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      fVar31 = *pMVar6[1].data;
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) = fVar31 / *(float *)((long)pvVar15 + uVar17 * 4)
            ;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (((uVar26 == 1) && (uVar2 == 1)) && (uVar3 == uVar5)) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      pvVar23 = pMVar6[1].data;
      sVar9 = pMVar6[1].elemsize;
      sVar10 = pMVar6[1].cstep;
      sVar11 = this_00->elemsize;
      sVar12 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) =
                 *(float *)((long)pvVar23 + sVar9 * sVar10 * uVar24) /
                 *(float *)((long)pvVar15 + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (uVar26 == uVar1) {
      if (uVar3 == 1 && uVar4 == uVar2) {
        Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar23 + uVar17 * 4) / *(float *)((long)pvVar15 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (((uVar18 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) {
        if (uVar5 == 1 && uVar4 == uVar2) {
          Mat::create(this_00,uVar1,uVar4,uVar3,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          sVar8 = pMVar6[1].elemsize;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar20) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar23 + uVar18 * 4) / *(float *)((long)pvVar15 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar20 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
          } while (uVar17 != uVar24);
          return 0;
        }
LAB_0022a9fb:
        if ((((uVar1 != 1) && (uVar26 == 1)) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          sVar9 = pMVar6[1].elemsize;
          sVar10 = pMVar6[1].cstep;
          pvVar23 = pMVar6[1].data;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar6->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar17 = 0;
              pvVar19 = pvVar15;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar1) {
                  fVar31 = *(float *)((long)pvVar23 + uVar17 * 4 + sVar9 * sVar10 * uVar24);
                  uVar27 = 0;
                  do {
                    *(float *)((long)pvVar29 + uVar27 * 4) =
                         fVar31 / *(float *)((long)pvVar19 + uVar27 * 4);
                    uVar27 = uVar27 + 1;
                  } while (uVar18 != uVar27);
                }
                uVar17 = uVar17 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
              } while (uVar17 != uVar21);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar26 == uVar1) && (uVar4 != 1)) && ((uVar2 == 1 && (uVar3 == uVar5)))) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          pvVar23 = pMVar6[1].data;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = pMVar6[1].cstep;
          sVar12 = pMVar6->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar26 = 0;
              pvVar19 = pvVar15;
              pvVar29 = pvVar13;
              do {
                if (0 < (int)uVar1) {
                  uVar17 = 0;
                  do {
                    *(float *)((long)pvVar29 + uVar17 * 4) =
                         *(float *)((long)pvVar23 + uVar17 * 4) /
                         *(float *)((long)pvVar19 + uVar17 * 4);
                    uVar17 = uVar17 + 1;
                  } while (uVar18 != uVar17);
                }
                uVar26 = uVar26 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
                pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
              } while (uVar26 != uVar4);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
            pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar11);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar18 == 1 && uVar26 != 1) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
          Mat::create(this_00,uVar26,uVar4,uVar5,sVar7,opt->blob_allocator);
          pvVar13 = this_00->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar7 = this_00->cstep;
          if ((long)this_00->c * sVar7 == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          sVar8 = pMVar6->elemsize;
          sVar9 = pMVar6->cstep;
          pvVar23 = pMVar6[1].data;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = this_00->elemsize;
          sVar12 = pMVar6[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar18 = 0;
              pvVar19 = pvVar13;
              pvVar29 = pvVar23;
              do {
                if (0 < (int)uVar26) {
                  fVar31 = *(float *)((long)pvVar15 + uVar18 * 4 + sVar8 * sVar9 * uVar24);
                  uVar27 = 0;
                  do {
                    *(float *)((long)pvVar19 + uVar27 * 4) =
                         *(float *)((long)pvVar29 + uVar27 * 4) * (1.0 / fVar31);
                    uVar27 = uVar27 + 1;
                  } while (uVar17 != uVar27);
                }
                uVar18 = uVar18 + 1;
                pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
                pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
              } while (uVar18 != uVar21);
            }
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
            pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
          } while (uVar24 != uVar16);
          return 0;
        }
        if (((uVar2 == 1 || uVar21 != 1) || uVar26 != uVar1) || (uVar3 != uVar5)) {
          Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
          if (local_68->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_68->c * local_68->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          local_e0 = 0;
          do {
            pMVar6 = local_50;
            bVar30 = local_50->dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_50->d;
            }
            local_b8.w = local_50->w;
            local_b8.h = local_50->h;
            local_b8.dims = bVar30 ^ 3;
            sVar7 = local_50->cstep;
            pvVar13 = local_50->data;
            sVar8 = local_50->elemsize;
            local_b8.data = (void *)(sVar7 * local_e0 * sVar8 + (long)pvVar13);
            local_b8.elempack = local_50->elempack;
            local_b8.allocator = local_50->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar8;
            Mat::~Mat(&local_b8);
            bVar30 = pMVar6[1].dims == 3;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = pMVar6[1].d;
            }
            local_b8.w = pMVar6[1].w;
            local_b8.h = pMVar6[1].h;
            local_b8.dims = bVar30 ^ 3;
            local_70 = pMVar6[1].cstep;
            pvVar15 = pMVar6[1].data;
            local_b8.elemsize = pMVar6[1].elemsize;
            local_b8.data = (void *)(local_70 * local_e0 * local_b8.elemsize + (long)pvVar15);
            local_b8.elempack = pMVar6[1].elempack;
            local_b8.allocator = pMVar6[1].allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_60 = (void *)local_b8.elemsize;
            Mat::~Mat(&local_b8);
            bVar30 = local_68->dims == 3;
            local_b8.w = local_68->w;
            local_b8.h = local_68->h;
            local_b8.c = 1;
            if (!bVar30) {
              local_b8.c = local_68->d;
            }
            local_b8.dims = bVar30 ^ 3;
            sVar9 = local_68->cstep;
            pvVar23 = local_68->data;
            sVar10 = local_68->elemsize;
            local_b8.data = (void *)(sVar9 * local_e0 * sVar10 + (long)pvVar23);
            local_b8.elempack = local_68->elempack;
            local_b8.allocator = local_68->allocator;
            local_b8.refcount = (int *)0x0;
            local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
            local_b8.d = 1;
            local_b8.elemsize = sVar10;
            Mat::~Mat(&local_b8);
            if (0 < (int)uVar14) {
              uVar24 = 0;
              do {
                *(float *)((long)pvVar23 + uVar24 * 4 + sVar9 * sVar10 * local_e0) =
                     *(float *)((long)pvVar15 + uVar24 * 4 + local_70 * (long)local_60 * local_e0) /
                     *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_e0);
                uVar24 = uVar24 + 1;
              } while (uVar14 != uVar24);
            }
            local_e0 = local_e0 + 1;
          } while (local_e0 != uVar16);
          return 0;
        }
        Mat::create(this_00,uVar1,uVar2,uVar5,sVar7,opt->blob_allocator);
        if (local_68->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_68->c * local_68->cstep == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        local_d8 = 0;
        do {
          pMVar6 = local_50;
          bVar30 = local_50->dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_50->d;
          }
          local_b8.w = local_50->w;
          local_b8.h = local_50->h;
          local_b8.dims = bVar30 ^ 3;
          sVar7 = local_50->cstep;
          pvVar13 = local_50->data;
          sVar8 = local_50->elemsize;
          local_b8.data = (void *)(sVar7 * local_d8 * sVar8 + (long)pvVar13);
          local_b8.elempack = local_50->elempack;
          local_b8.allocator = local_50->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_b8.elemsize = sVar8;
          Mat::~Mat(&local_b8);
          bVar30 = pMVar6[1].dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = pMVar6[1].d;
          }
          local_b8.w = pMVar6[1].w;
          local_b8.h = pMVar6[1].h;
          local_b8.dims = bVar30 ^ 3;
          local_70 = pMVar6[1].cstep;
          pvVar15 = pMVar6[1].data;
          local_b8.elemsize = pMVar6[1].elemsize;
          local_b8.data = (void *)(local_70 * local_d8 * local_b8.elemsize + (long)pvVar15);
          local_b8.elempack = pMVar6[1].elempack;
          local_b8.allocator = pMVar6[1].allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_60 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          bVar30 = local_68->dims == 3;
          local_b8.w = local_68->w;
          local_b8.h = local_68->h;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_68->d;
          }
          local_b8.dims = bVar30 ^ 3;
          local_58 = (void *)local_68->cstep;
          pvVar23 = local_68->data;
          local_b8.elemsize = local_68->elemsize;
          local_b8.data = (void *)((long)local_58 * local_d8 * local_b8.elemsize + (long)pvVar23);
          local_b8.elempack = local_68->elempack;
          local_b8.allocator = local_68->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_48 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          if (0 < (int)uVar2) {
            pvVar23 = (void *)((long)pvVar23 + (long)local_58 * (long)local_48 * local_d8);
            pvVar15 = (void *)((long)pvVar15 + local_70 * (long)local_60 * local_d8);
            uVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar23 + uVar24 * 4) =
                       *(float *)((long)pvVar15 + uVar24 * 4) /
                       *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_d8);
                  uVar24 = uVar24 + 1;
                } while (uVar18 != uVar24);
              }
              uVar26 = uVar26 + 1;
              pvVar23 = (void *)((long)pvVar23 + lVar22 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
            } while (uVar26 != uVar2);
          }
          local_d8 = local_d8 + 1;
        } while (local_d8 != uVar16);
        return 0;
      }
    }
    else if (((uVar18 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) goto LAB_0022a9fb;
    Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
    pvVar13 = this_00->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    sVar7 = this_00->cstep;
    if ((long)this_00->c * sVar7 == 0) {
      return -100;
    }
    if ((int)uVar3 < 1) {
      return 0;
    }
    pvVar15 = pMVar6->data;
    sVar8 = pMVar6->elemsize;
    sVar9 = pMVar6->cstep;
    pvVar23 = pMVar6[1].data;
    sVar10 = pMVar6[1].elemsize;
    sVar11 = this_00->elemsize;
    sVar12 = pMVar6[1].cstep;
    uVar17 = 0;
    do {
      if (0 < (int)uVar20) {
        uVar18 = 0;
        do {
          *(float *)((long)pvVar13 + uVar18 * 4) =
               *(float *)((long)pvVar23 + uVar18 * 4) /
               *(float *)((long)pvVar15 + sVar8 * sVar9 * uVar17);
          uVar18 = uVar18 + 1;
        } while (uVar20 != uVar18);
      }
      uVar17 = uVar17 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
      pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
    } while (uVar17 != uVar24);
    return 0;
  }
  uVar1 = pMVar6->w;
  lVar22 = (long)(int)uVar1;
  uVar17 = (ulong)uVar1;
  sVar7 = pMVar6->elemsize;
  uVar26 = pMVar6[1].w;
  lVar28 = (long)(int)uVar26;
  uVar18 = (ulong)uVar26;
  uVar2 = pMVar6[1].h;
  uVar3 = pMVar6[1].c;
  uVar24 = (ulong)uVar3;
  uVar20 = uVar2 * uVar26;
  iVar25 = pMVar6->dims;
  if (iVar25 == 1) {
    iVar25 = pMVar6[1].dims;
    if (uVar1 != 1) {
      if (iVar25 == 1) {
        Mat::create(this_00,uVar1,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar6[1].w != 1) {
          if ((int)uVar1 < 1) {
            return 0;
          }
          pvVar15 = pMVar6->data;
          pvVar23 = pMVar6[1].data;
          uVar24 = 0;
          do {
            *(float *)((long)pvVar13 + uVar24 * 4) =
                 *(float *)((long)pvVar23 + uVar24 * 4) + *(float *)((long)pvVar15 + uVar24 * 4);
            uVar24 = uVar24 + 1;
          } while (uVar17 != uVar24);
          return 0;
        }
        if ((int)uVar1 < 1) {
          return 0;
        }
        fVar31 = *pMVar6[1].data;
        pvVar15 = pMVar6->data;
        uVar24 = 0;
        do {
          *(float *)((long)pvVar13 + uVar24 * 4) = *(float *)((long)pvVar15 + uVar24 * 4) + fVar31;
          uVar24 = uVar24 + 1;
        } while (uVar17 != uVar24);
        return 0;
      }
      if (iVar25 == 2) {
        Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        uVar24 = 0;
        do {
          if (0 < (int)uVar26) {
            fVar31 = *(float *)((long)pvVar15 + uVar24 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar23 + uVar17 * 4) + fVar31;
              uVar17 = uVar17 + 1;
            } while (uVar18 != uVar17);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar28 * 4);
          pvVar23 = (void *)((long)pvVar23 + lVar28 * 4);
        } while (uVar24 != uVar2);
        return 0;
      }
      if (iVar25 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar3 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      pvVar23 = pMVar6[1].data;
      sVar8 = pMVar6[1].elemsize;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6[1].cstep;
      uVar17 = 0;
      do {
        if (0 < (int)uVar20) {
          fVar31 = *(float *)((long)pvVar15 + uVar17 * 4);
          uVar18 = 0;
          do {
            *(float *)((long)pvVar13 + uVar18 * 4) = *(float *)((long)pvVar23 + uVar18 * 4) + fVar31
            ;
            uVar18 = uVar18 + 1;
          } while (uVar20 != uVar18);
        }
        uVar17 = uVar17 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
      } while (uVar17 != uVar24);
      return 0;
    }
    if (iVar25 == 1) {
      Mat::create(this_00,uVar26,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if ((int)uVar26 < 1) {
        return 0;
      }
      fVar31 = *pMVar6->data;
      pvVar15 = pMVar6[1].data;
      uVar24 = 0;
      do {
        *(float *)((long)pvVar13 + uVar24 * 4) = *(float *)((long)pvVar15 + uVar24 * 4) + fVar31;
        uVar24 = uVar24 + 1;
      } while (uVar18 != uVar24);
      return 0;
    }
    if (iVar25 == 2) {
      Mat::create(this_00,uVar26,uVar2,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if ((int)uVar20 < 1) {
        return 0;
      }
      fVar31 = *pMVar6->data;
      pvVar15 = pMVar6[1].data;
      uVar24 = 0;
      do {
        *(float *)((long)pvVar13 + uVar24 * 4) = *(float *)((long)pvVar15 + uVar24 * 4) + fVar31;
        uVar24 = uVar24 + 1;
      } while (uVar20 != uVar24);
      return 0;
    }
    if (iVar25 != 3) {
      return 0;
    }
    Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
    pvVar13 = this_00->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    sVar7 = this_00->cstep;
    if ((long)this_00->c * sVar7 == 0) {
      return -100;
    }
    if ((int)uVar3 < 1) {
      return 0;
    }
    fVar31 = *pMVar6->data;
    pvVar15 = pMVar6[1].data;
    sVar8 = pMVar6[1].elemsize;
    sVar9 = this_00->elemsize;
    sVar10 = pMVar6[1].cstep;
    uVar17 = 0;
    do {
      if (0 < (int)uVar20) {
        uVar18 = 0;
        do {
          *(float *)((long)pvVar13 + uVar18 * 4) = *(float *)((long)pvVar15 + uVar18 * 4) + fVar31;
          uVar18 = uVar18 + 1;
        } while (uVar20 != uVar18);
      }
      uVar17 = uVar17 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
      pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
    } while (uVar17 != uVar24);
    return 0;
  }
  uVar4 = pMVar6->h;
  uVar21 = (ulong)uVar4;
  uVar14 = uVar4 * uVar1;
  if (iVar25 == 2) {
    if (pMVar6[1].dims == 3) {
      Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar3 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      pvVar23 = pMVar6[1].data;
      iVar25 = pMVar6->w;
      sVar8 = pMVar6->elemsize;
      sVar9 = pMVar6[1].elemsize;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar6[1].cstep;
      uVar17 = 0;
      do {
        if (0 < (int)uVar2) {
          uVar21 = 0;
          pvVar19 = pvVar23;
          pvVar29 = pvVar13;
          do {
            if (0 < (int)uVar26) {
              fVar31 = *(float *)((long)pvVar15 + uVar21 * 4 + (long)iVar25 * sVar8 * uVar17);
              uVar16 = 0;
              do {
                *(float *)((long)pvVar29 + uVar16 * 4) =
                     *(float *)((long)pvVar19 + uVar16 * 4) + fVar31;
                uVar16 = uVar16 + 1;
              } while (uVar18 != uVar16);
            }
            uVar21 = uVar21 + 1;
            pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
            pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
          } while (uVar21 != uVar2);
        }
        uVar17 = uVar17 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
        pvVar23 = (void *)((long)pvVar23 + sVar9 * sVar11);
      } while (uVar17 != uVar24);
      return 0;
    }
    Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
    pvVar13 = this_00->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar6[1].dims != 1) {
      if (pMVar6[1].dims != 2) {
        return 0;
      }
      if ((int)uVar14 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      pvVar23 = pMVar6[1].data;
      uVar24 = 0;
      do {
        *(float *)((long)pvVar13 + uVar24 * 4) =
             *(float *)((long)pvVar23 + uVar24 * 4) + *(float *)((long)pvVar15 + uVar24 * 4);
        uVar24 = uVar24 + 1;
      } while (uVar14 != uVar24);
      return 0;
    }
    Mat::create(this_00,uVar1,uVar4,sVar7,opt->blob_allocator);
    pvVar13 = this_00->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar6[1].w != 1) {
      if ((int)uVar4 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      pvVar23 = pMVar6[1].data;
      uVar24 = 0;
      do {
        if (0 < (int)uVar1) {
          fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
          uVar18 = 0;
          do {
            *(float *)((long)pvVar13 + uVar18 * 4) = *(float *)((long)pvVar15 + uVar18 * 4) + fVar31
            ;
            uVar18 = uVar18 + 1;
          } while (uVar17 != uVar18);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + lVar22 * 4);
        pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
      } while (uVar24 != uVar21);
      return 0;
    }
    if ((int)uVar14 < 1) {
      return 0;
    }
    fVar31 = *pMVar6[1].data;
    pvVar15 = pMVar6->data;
    uVar24 = 0;
    do {
      *(float *)((long)pvVar13 + uVar24 * 4) = *(float *)((long)pvVar15 + uVar24 * 4) + fVar31;
      uVar24 = uVar24 + 1;
    } while (uVar14 != uVar24);
    return 0;
  }
  if (iVar25 != 3) {
    return 0;
  }
  uVar5 = pMVar6->c;
  uVar16 = (ulong)uVar5;
  if (pMVar6[1].dims != 3) {
    Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
    pvVar13 = this_00->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    sVar7 = this_00->cstep;
    if ((long)this_00->c * sVar7 == 0) {
      return -100;
    }
    if (pMVar6[1].dims != 1) {
      if (pMVar6[1].dims != 2) {
        return 0;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      iVar25 = pMVar6[1].w;
      sVar9 = pMVar6[1].elemsize;
      pvVar23 = pMVar6[1].data;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar4) {
          uVar18 = 0;
          pvVar19 = pvVar15;
          pvVar29 = pvVar13;
          do {
            if (0 < (int)uVar1) {
              fVar31 = *(float *)((long)pvVar23 + uVar18 * 4 + (long)iVar25 * sVar9 * uVar24);
              uVar27 = 0;
              do {
                *(float *)((long)pvVar29 + uVar27 * 4) =
                     *(float *)((long)pvVar19 + uVar27 * 4) + fVar31;
                uVar27 = uVar27 + 1;
              } while (uVar17 != uVar27);
            }
            uVar18 = uVar18 + 1;
            pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
            pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
          } while (uVar18 != uVar21);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar10);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (pMVar6[1].w != 1) {
      if ((int)uVar5 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      pvVar23 = pMVar6[1].data;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          fVar31 = *(float *)((long)pvVar23 + uVar24 * 4);
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) = *(float *)((long)pvVar15 + uVar17 * 4) + fVar31
            ;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      } while (uVar24 != uVar16);
      return 0;
    }
    if ((int)uVar5 < 1) {
      return 0;
    }
    fVar31 = *pMVar6[1].data;
    pvVar15 = pMVar6->data;
    sVar8 = pMVar6->elemsize;
    sVar9 = this_00->elemsize;
    sVar10 = pMVar6->cstep;
    uVar24 = 0;
    do {
      if (0 < (int)uVar14) {
        uVar17 = 0;
        do {
          *(float *)((long)pvVar13 + uVar17 * 4) = *(float *)((long)pvVar15 + uVar17 * 4) + fVar31;
          uVar17 = uVar17 + 1;
        } while (uVar14 != uVar17);
      }
      uVar24 = uVar24 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
      pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
    } while (uVar24 != uVar16);
    return 0;
  }
  if (((uVar26 == 1) && (uVar2 == 1)) && (uVar3 == uVar5)) {
    Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
    pvVar13 = this_00->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    sVar7 = this_00->cstep;
    if ((long)this_00->c * sVar7 == 0) {
      return -100;
    }
    if ((int)uVar5 < 1) {
      return 0;
    }
    pvVar15 = pMVar6->data;
    sVar8 = pMVar6->elemsize;
    pvVar23 = pMVar6[1].data;
    sVar9 = pMVar6[1].elemsize;
    sVar10 = pMVar6[1].cstep;
    sVar11 = this_00->elemsize;
    sVar12 = pMVar6->cstep;
    uVar24 = 0;
    do {
      if (0 < (int)uVar14) {
        uVar17 = 0;
        do {
          *(float *)((long)pvVar13 + uVar17 * 4) =
               *(float *)((long)pvVar23 + sVar9 * sVar10 * uVar24) +
               *(float *)((long)pvVar15 + uVar17 * 4);
          uVar17 = uVar17 + 1;
        } while (uVar14 != uVar17);
      }
      uVar24 = uVar24 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
      pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
    } while (uVar24 != uVar16);
    return 0;
  }
  if (uVar26 == uVar1) {
    if (uVar3 == 1 && uVar4 == uVar2) {
      Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
      pvVar13 = this_00->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar7 = this_00->cstep;
      if ((long)this_00->c * sVar7 == 0) {
        return -100;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      pvVar15 = pMVar6->data;
      sVar8 = pMVar6->elemsize;
      pvVar23 = pMVar6[1].data;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6->cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) =
                 *(float *)((long)pvVar23 + uVar17 * 4) + *(float *)((long)pvVar15 + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar24 = uVar24 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      } while (uVar24 != uVar16);
      return 0;
    }
    if (((uVar17 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) {
      if (uVar5 == 1 && uVar4 == uVar2) {
        Mat::create(this_00,uVar1,uVar4,uVar3,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        pvVar23 = pMVar6[1].data;
        sVar8 = pMVar6[1].elemsize;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6[1].cstep;
        uVar17 = 0;
        do {
          if (0 < (int)uVar20) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar23 + uVar18 * 4) + *(float *)((long)pvVar15 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar20 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar23 = (void *)((long)pvVar23 + sVar8 * sVar10);
        } while (uVar17 != uVar24);
        return 0;
      }
LAB_00229d47:
      if ((((uVar1 != 1) && (uVar26 == 1)) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
        Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        sVar9 = pMVar6[1].elemsize;
        sVar10 = pMVar6[1].cstep;
        pvVar23 = pMVar6[1].data;
        sVar11 = this_00->elemsize;
        sVar12 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar4) {
            uVar18 = 0;
            pvVar19 = pvVar15;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar1) {
                fVar31 = *(float *)((long)pvVar23 + uVar18 * 4 + sVar9 * sVar10 * uVar24);
                uVar27 = 0;
                do {
                  *(float *)((long)pvVar29 + uVar27 * 4) =
                       *(float *)((long)pvVar19 + uVar27 * 4) + fVar31;
                  uVar27 = uVar27 + 1;
                } while (uVar17 != uVar27);
              }
              uVar18 = uVar18 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
            } while (uVar18 != uVar21);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (((uVar26 == uVar1) && (uVar4 != 1)) && ((uVar2 == 1 && (uVar3 == uVar5)))) {
        Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        pvVar23 = pMVar6[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6[1].elemsize;
        sVar11 = pMVar6[1].cstep;
        sVar12 = pMVar6->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar4) {
            uVar26 = 0;
            pvVar19 = pvVar15;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar1) {
                uVar18 = 0;
                do {
                  *(float *)((long)pvVar29 + uVar18 * 4) =
                       *(float *)((long)pvVar23 + uVar18 * 4) +
                       *(float *)((long)pvVar19 + uVar18 * 4);
                  uVar18 = uVar18 + 1;
                } while (uVar17 != uVar18);
              }
              uVar26 = uVar26 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar22 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
            } while (uVar26 != uVar4);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar9);
          pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar11);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (((uVar17 == 1 && uVar26 != 1) && (uVar2 == uVar4)) && (uVar3 == uVar5)) {
        Mat::create(this_00,uVar26,uVar4,uVar5,sVar7,opt->blob_allocator);
        pvVar13 = this_00->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar7 = this_00->cstep;
        if ((long)this_00->c * sVar7 == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pvVar15 = pMVar6->data;
        sVar8 = pMVar6->elemsize;
        sVar9 = pMVar6->cstep;
        pvVar23 = pMVar6[1].data;
        sVar10 = pMVar6[1].elemsize;
        sVar11 = this_00->elemsize;
        sVar12 = pMVar6[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar4) {
            uVar17 = 0;
            pvVar19 = pvVar23;
            pvVar29 = pvVar13;
            do {
              if (0 < (int)uVar26) {
                fVar31 = *(float *)((long)pvVar15 + uVar17 * 4 + sVar8 * sVar9 * uVar24);
                uVar27 = 0;
                do {
                  *(float *)((long)pvVar29 + uVar27 * 4) =
                       *(float *)((long)pvVar19 + uVar27 * 4) + fVar31;
                  uVar27 = uVar27 + 1;
                } while (uVar18 != uVar27);
              }
              uVar17 = uVar17 + 1;
              pvVar29 = (void *)((long)pvVar29 + lVar28 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar28 * 4);
            } while (uVar17 != uVar21);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
          pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
        } while (uVar24 != uVar16);
        return 0;
      }
      if (((uVar2 == 1 || uVar21 != 1) || uVar26 != uVar1) || (uVar3 != uVar5)) {
        Mat::create(this_00,uVar1,uVar4,uVar5,sVar7,opt->blob_allocator);
        if (local_68->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_68->c * local_68->cstep == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        local_e0 = 0;
        do {
          pMVar6 = local_50;
          bVar30 = local_50->dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_50->d;
          }
          local_b8.w = local_50->w;
          local_b8.h = local_50->h;
          local_b8.dims = bVar30 ^ 3;
          sVar7 = local_50->cstep;
          pvVar13 = local_50->data;
          sVar8 = local_50->elemsize;
          local_b8.data = (void *)(sVar7 * local_e0 * sVar8 + (long)pvVar13);
          local_b8.elempack = local_50->elempack;
          local_b8.allocator = local_50->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_b8.elemsize = sVar8;
          Mat::~Mat(&local_b8);
          bVar30 = pMVar6[1].dims == 3;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = pMVar6[1].d;
          }
          local_b8.w = pMVar6[1].w;
          local_b8.h = pMVar6[1].h;
          local_b8.dims = bVar30 ^ 3;
          local_70 = pMVar6[1].cstep;
          pvVar15 = pMVar6[1].data;
          local_b8.elemsize = pMVar6[1].elemsize;
          local_b8.data = (void *)(local_70 * local_e0 * local_b8.elemsize + (long)pvVar15);
          local_b8.elempack = pMVar6[1].elempack;
          local_b8.allocator = pMVar6[1].allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_60 = (void *)local_b8.elemsize;
          Mat::~Mat(&local_b8);
          bVar30 = local_68->dims == 3;
          local_b8.w = local_68->w;
          local_b8.h = local_68->h;
          local_b8.c = 1;
          if (!bVar30) {
            local_b8.c = local_68->d;
          }
          local_b8.dims = bVar30 ^ 3;
          sVar9 = local_68->cstep;
          pvVar23 = local_68->data;
          sVar10 = local_68->elemsize;
          local_b8.data = (void *)(sVar9 * local_e0 * sVar10 + (long)pvVar23);
          local_b8.elempack = local_68->elempack;
          local_b8.allocator = local_68->allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
          local_b8.d = 1;
          local_b8.elemsize = sVar10;
          Mat::~Mat(&local_b8);
          if (0 < (int)uVar14) {
            uVar24 = 0;
            do {
              *(float *)((long)pvVar23 + uVar24 * 4 + sVar9 * sVar10 * local_e0) =
                   *(float *)((long)pvVar15 + uVar24 * 4 + local_70 * (long)local_60 * local_e0) +
                   *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_e0);
              uVar24 = uVar24 + 1;
            } while (uVar14 != uVar24);
          }
          local_e0 = local_e0 + 1;
        } while (local_e0 != uVar16);
        return 0;
      }
      Mat::create(this_00,uVar1,uVar2,uVar5,sVar7,opt->blob_allocator);
      if (local_68->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_68->c * local_68->cstep == 0) {
        return -100;
      }
      if ((int)uVar5 < 1) {
        return 0;
      }
      local_d8 = 0;
      do {
        pMVar6 = local_50;
        bVar30 = local_50->dims == 3;
        local_b8.c = 1;
        if (!bVar30) {
          local_b8.c = local_50->d;
        }
        local_b8.w = local_50->w;
        local_b8.h = local_50->h;
        local_b8.dims = bVar30 ^ 3;
        sVar7 = local_50->cstep;
        pvVar13 = local_50->data;
        sVar8 = local_50->elemsize;
        local_b8.data = (void *)(sVar7 * local_d8 * sVar8 + (long)pvVar13);
        local_b8.elempack = local_50->elempack;
        local_b8.allocator = local_50->allocator;
        local_b8.refcount = (int *)0x0;
        local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
        local_b8.d = 1;
        local_b8.elemsize = sVar8;
        Mat::~Mat(&local_b8);
        bVar30 = pMVar6[1].dims == 3;
        local_b8.c = 1;
        if (!bVar30) {
          local_b8.c = pMVar6[1].d;
        }
        local_b8.w = pMVar6[1].w;
        local_b8.h = pMVar6[1].h;
        local_b8.dims = bVar30 ^ 3;
        local_70 = pMVar6[1].cstep;
        pvVar15 = pMVar6[1].data;
        local_b8.elemsize = pMVar6[1].elemsize;
        local_b8.data = (void *)(local_70 * local_d8 * local_b8.elemsize + (long)pvVar15);
        local_b8.elempack = pMVar6[1].elempack;
        local_b8.allocator = pMVar6[1].allocator;
        local_b8.refcount = (int *)0x0;
        local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
        local_b8.d = 1;
        local_60 = (void *)local_b8.elemsize;
        Mat::~Mat(&local_b8);
        bVar30 = local_68->dims == 3;
        local_b8.w = local_68->w;
        local_b8.h = local_68->h;
        local_b8.c = 1;
        if (!bVar30) {
          local_b8.c = local_68->d;
        }
        local_b8.dims = bVar30 ^ 3;
        local_58 = (void *)local_68->cstep;
        pvVar23 = local_68->data;
        local_b8.elemsize = local_68->elemsize;
        local_b8.data = (void *)((long)local_58 * local_d8 * local_b8.elemsize + (long)pvVar23);
        local_b8.elempack = local_68->elempack;
        local_b8.allocator = local_68->allocator;
        local_b8.refcount = (int *)0x0;
        local_b8.cstep = (long)local_b8.h * (long)local_b8.w;
        local_b8.d = 1;
        local_48 = (void *)local_b8.elemsize;
        Mat::~Mat(&local_b8);
        if (0 < (int)uVar2) {
          pvVar23 = (void *)((long)pvVar23 + (long)local_58 * (long)local_48 * local_d8);
          pvVar15 = (void *)((long)pvVar15 + local_70 * (long)local_60 * local_d8);
          uVar26 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar24 = 0;
              do {
                *(float *)((long)pvVar23 + uVar24 * 4) =
                     *(float *)((long)pvVar15 + uVar24 * 4) +
                     *(float *)((long)pvVar13 + uVar24 * 4 + sVar7 * sVar8 * local_d8);
                uVar24 = uVar24 + 1;
              } while (uVar17 != uVar24);
            }
            uVar26 = uVar26 + 1;
            pvVar23 = (void *)((long)pvVar23 + lVar22 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
          } while (uVar26 != uVar2);
        }
        local_d8 = local_d8 + 1;
      } while (local_d8 != uVar16);
      return 0;
    }
  }
  else if (((uVar17 != 1) || (uVar4 != 1)) || (uVar3 != uVar5)) goto LAB_00229d47;
  Mat::create(this_00,uVar26,uVar2,uVar3,sVar7,opt->blob_allocator);
  pvVar13 = this_00->data;
  iVar25 = -100;
  if (((pvVar13 != (void *)0x0) && (sVar7 = this_00->cstep, (long)this_00->c * sVar7 != 0)) &&
     (iVar25 = 0, 0 < (int)uVar3)) {
    pvVar15 = pMVar6->data;
    sVar8 = pMVar6->elemsize;
    sVar9 = pMVar6->cstep;
    pvVar23 = pMVar6[1].data;
    sVar10 = pMVar6[1].elemsize;
    sVar11 = this_00->elemsize;
    sVar12 = pMVar6[1].cstep;
    uVar17 = 0;
    do {
      if (0 < (int)uVar20) {
        uVar18 = 0;
        do {
          *(float *)((long)pvVar13 + uVar18 * 4) =
               *(float *)((long)pvVar23 + uVar18 * 4) +
               *(float *)((long)pvVar15 + sVar8 * sVar9 * uVar17);
          uVar18 = uVar18 + 1;
        } while (uVar20 != uVar18);
      }
      uVar17 = uVar17 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar11);
      pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar12);
      iVar25 = 0;
    } while (uVar17 != uVar24);
  }
  return iVar25;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    if (op_type == Operation_ADD)
        return binary_op<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_SUB)
        return binary_op<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MUL)
        return binary_op<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_DIV)
        return binary_op<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MAX)
        return binary_op<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MIN)
        return binary_op<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_POW)
        return binary_op<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RSUB)
        return binary_op<binary_op_rsub>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RDIV)
        return binary_op<binary_op_rdiv>(bottom_blob, bottom_blob1, top_blob, opt);

    return 0;
}